

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(NodeRecordMB4D *__return_storage_ptr__,
         BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
         *this,BuildRecord *current,CachedAllocator alloc,bool toplevel)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  float fVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  size_t begin_00;
  undefined8 *puVar6;
  ThreadLocal2 *pTVar7;
  iterator iVar8;
  BBox1f *pBVar9;
  MemoryMonitorInterface *pMVar10;
  Split *pSVar11;
  Split *pSVar12;
  vint *pvVar13;
  float fVar14;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  SetMB *set;
  vint vVar21;
  char cVar22;
  long *plVar23;
  MutexSys *this_00;
  ulong uVar24;
  BBox1f BVar25;
  long lVar26;
  void *pvVar27;
  unsigned_long uVar28;
  PrimRefVector pmVar29;
  PrimRefMB *pPVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar31;
  float *pfVar32;
  size_t sVar33;
  runtime_error *prVar34;
  long lVar35;
  BBox1f BVar36;
  uint *puVar37;
  BBox1f *pBVar38;
  BuildRecord *current_00;
  size_t begin;
  ulong uVar39;
  unsigned_long uVar40;
  char *pcVar41;
  ulong uVar42;
  BBox1f BVar43;
  byte bVar44;
  size_t end;
  bool bVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar65;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  task_group_context *in_stack_ffffffffffffe5b8;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1a28;
  BBox1f local_1a20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_19f8;
  SetMB *local_19e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_19d8;
  ulong local_19c8;
  BBox1f time_range1_1;
  BBox1f time_range0_1;
  PrimRefVector lprims_1;
  anon_class_24_3_c5d13451 isLeft;
  undefined4 uStack_1990;
  undefined4 uStack_198c;
  undefined1 auStack_1988 [8];
  undefined8 uStack_1980;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1978;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1968;
  BBox1f local_1958;
  char acStack_1950 [8];
  unsigned_long uStack_1948;
  unsigned_long uStack_1940;
  size_t local_1938;
  size_t sStack_1930;
  undefined4 uStack_1928;
  undefined4 uStack_1924;
  undefined4 uStack_1920;
  undefined4 uStack_191c;
  undefined1 auStack_1918 [16];
  BBox1f local_1908;
  PrimRefVector lprims;
  undefined8 local_18e8;
  undefined1 local_18e0 [8];
  anon_class_1_0_00000001 reduction;
  float fStack_1850;
  vbool vSplitMask;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1828;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1818;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aStack_1808;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_17e8;
  size_t local_17d8;
  size_t sStack_17d0;
  size_t sStack_17c8;
  size_t sStack_17c0;
  float local_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  BBox1f time_range1;
  vint vSplitPos;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1768;
  intrusive_list_node *piStack_1758;
  intrusive_list_node *piStack_1750;
  atomic<tbb::detail::r1::tbb_exception_ptr_*> local_1748;
  void *pvStack_1740;
  string_resource_index sStack_1738;
  char acStack_1730 [8];
  char local_1728 [8];
  char acStack_1720 [8];
  unsigned_long uStack_1718;
  unsigned_long uStack_1710;
  unsigned_long local_1708;
  size_t sStack_1700;
  size_t sStack_16f8;
  undefined8 uStack_16f0;
  undefined1 auStack_16e8 [16];
  BBox1f local_16d8;
  anon_class_1_0_00000001 reduction2;
  undefined4 uStack_16c4;
  anon_class_1_0_00000001 reduction2_1;
  undefined1 local_1618 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_15f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_15e8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_15d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_15c8;
  range<unsigned_long> local_15b8;
  size_t local_15a8;
  size_t local_15a0;
  BBox1f local_1598;
  BBox1f BStack_1590;
  undefined1 auStack_1588 [16];
  BBox1f local_1578;
  vint vSplitPos_1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_14e8;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  unsigned_long uStack_1498;
  unsigned_long uStack_1490;
  size_t local_1488;
  size_t sStack_1480;
  size_t local_1478;
  size_t sStack_1470;
  undefined1 auStack_1468 [16];
  BBox1f local_1458;
  BBox1f time_range0;
  anon_union_4_2_620955e9_for_BinSplit<32UL>_3 local_1440;
  uint uStack_143c;
  size_t sStack_1438;
  Split csplit;
  Lock<embree::MutexSys> lock;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_13b8;
  undefined1 local_13a8 [8];
  undefined8 uStack_13a0;
  undefined1 auStack_1398 [8];
  undefined8 uStack_1390;
  undefined1 local_1388 [8];
  undefined8 uStack_1380;
  undefined1 auStack_1378 [12];
  undefined4 uStack_136c;
  range<unsigned_long> local_1368;
  undefined1 auStack_1358 [8];
  BBox1f BStack_1350;
  undefined1 local_1348 [8];
  BBox1f aBStack_1340 [2];
  undefined8 uStack_1330;
  uint uStack_132c;
  BBox1f local_1328 [2];
  MutexSys *local_1318;
  size_t local_1308;
  undefined8 uStack_1300;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_12f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_12e8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_12d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_12c8;
  range<unsigned_long> local_12b8;
  size_t local_12a8;
  size_t local_12a0;
  BBox1f local_1298;
  BBox1f BStack_1290;
  undefined1 local_1288 [16];
  BBox1f local_1278;
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  long local_838;
  BBox1f local_830;
  undefined8 local_828;
  BBox1f BStack_648;
  long local_640;
  NodeRecordMB4D values [16];
  
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAlloc).super_Create.allocator;
    plVar23 = (long *)__tls_get_addr(&PTR_021a7d38);
    this_00 = (MutexSys *)*plVar23;
    if (this_00 == (MutexSys *)0x0) {
      this_00 = (MutexSys *)alignedMalloc(0xc0,0x40);
      MutexSys::MutexSys(this_00);
      this_00[1].mutex = (void *)0x0;
      this_00[8].mutex = this_00;
      this_00[9].mutex = (void *)0x0;
      this_00[10].mutex = (void *)0x0;
      this_00[0xb].mutex = (void *)0x0;
      this_00[0xc].mutex = (void *)0x0;
      this_00[0xb].mutex = (void *)0x0;
      this_00[0xc].mutex = (void *)0x0;
      this_00[0xd].mutex = (void *)0x0;
      this_00[0xe].mutex = (void *)0x0;
      this_00[0x10].mutex = this_00;
      this_00[0x11].mutex = (void *)0x0;
      this_00[0x12].mutex = (void *)0x0;
      this_00[0x13].mutex = (void *)0x0;
      this_00[0x14].mutex = (void *)0x0;
      this_00[0x13].mutex = (void *)0x0;
      this_00[0x14].mutex = (void *)0x0;
      this_00[0x15].mutex = (void *)0x0;
      this_00[0x16].mutex = (void *)0x0;
      *plVar23 = (long)this_00;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      values[0].ref.ptr = (size_t)this_00;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)values);
      if (values[0].ref.ptr != 0) {
        std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                  ((default_delete<embree::FastAllocator::ThreadLocal2> *)values,
                   (ThreadLocal2 *)values[0].ref.ptr);
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    }
    alloc.talloc0 = (ThreadLocal *)(this_00 + 8);
    alloc.talloc1 = (ThreadLocal *)(this_00 + 0x10);
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  if ((toplevel) &&
     (uVar24 = (current->prims).super_PrimInfoMB.object_range._end -
               (current->prims).super_PrimInfoMB.object_range._begin,
     uVar24 <= (this->cfg).singleThreadThreshold)) {
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar24;
    auVar47 = vpunpckldq_avx(auVar47,_DAT_01f7bac0);
    auVar47 = vsubpd_avx(auVar47,_DAT_01f7bad0);
    Scene::progressMonitor((this->progressMonitor).scene,auVar47._0_8_ + auVar47._8_8_);
  }
  local_19e0 = &current->prims;
  find(&csplit,this,local_19e0);
  set = local_19e0;
  bVar44 = (byte)(this->cfg).logBlockSize;
  sVar33 = (current->prims).super_PrimInfoMB.object_range._end;
  begin_00 = (current->prims).super_PrimInfoMB.object_range._begin;
  uVar24 = sVar33 - begin_00;
  if ((uVar24 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= current->depth + 8)) {
LAB_0135147e:
    SetMB::deterministic_order(local_19e0);
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf(__return_storage_ptr__,this,current,alloc_00);
    return __return_storage_ptr__;
  }
  fVar46 = (current->prims).super_PrimInfoMB.time_range.upper;
  fVar3 = (current->prims).super_PrimInfoMB.time_range.lower;
  if (uVar24 <= (this->cfg).maxLeafSize) {
    auVar67 = vsubps_avx((undefined1  [16])
                         (current->prims).super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                         field_0,(undefined1  [16])
                                 (current->prims).super_PrimInfoMB.
                                 super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                                 lower.field_0);
    auVar72 = vsubps_avx((undefined1  [16])
                         (current->prims).super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                         field_0,(undefined1  [16])
                                 (current->prims).super_PrimInfoMB.
                                 super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                                 lower.field_0);
    auVar47 = vmovshdup_avx(auVar67);
    auVar55 = vshufpd_avx(auVar67,auVar67,1);
    auVar54 = vmovshdup_avx(auVar72);
    auVar56 = vshufpd_avx(auVar72,auVar72,1);
    fVar14 = (fVar46 - fVar3) *
             ((auVar47._0_4_ + auVar55._0_4_) * auVar67._0_4_ + auVar47._0_4_ * auVar55._0_4_ +
             (auVar56._0_4_ + auVar54._0_4_) * auVar72._0_4_ + auVar56._0_4_ * auVar54._0_4_) * 0.5;
    fVar79 = (this->cfg).intCost;
    if (fVar79 * fVar14 * (float)(~(-1L << (bVar44 & 0x3f)) +
                                  (current->prims).super_PrimInfoMB.num_time_segments >>
                                 (bVar44 & 0x3f)) <=
        fVar14 * (this->cfg).travCost + fVar79 * csplit.sah) goto LAB_0135147e;
  }
  if (csplit.data == 0) {
    lock.mutex = (MutexSys *)0x7f8000007f800000;
    lock.locked = false;
    lock._9_3_ = 0x7f8000;
    lock._12_4_ = 0x7f800000;
    aStack_13b8._0_8_ = 0xff800000ff800000;
    aStack_13b8._8_8_ = 0xff800000ff800000;
    uStack_13a0._0_4_ = INFINITY;
    local_13a8 = (undefined1  [8])0x7f8000007f800000;
    uStack_13a0._4_4_ = 0x7f800000;
    uStack_1390._0_4_ = -INFINITY;
    auStack_1398 = (undefined1  [8])0xff800000ff800000;
    uStack_1390._4_4_ = 0xff800000;
    uStack_1380._0_4_ = INFINITY;
    local_1388 = (undefined1  [8])0x7f8000007f800000;
    uStack_1380._4_4_ = 0x7f800000;
    auStack_1378._8_4_ = -INFINITY;
    auStack_1378._0_8_ = 0xff800000ff800000;
    uStack_136c = 0xff800000;
    local_1368 = (range<unsigned_long>)ZEXT816(0);
    _auStack_1358 = ZEXT816(0);
    auVar73._8_4_ = 0x3f800000;
    auVar73._0_8_ = 0x3f8000003f800000;
    auVar73._12_4_ = 0x3f800000;
    uVar24 = vmovlps_avx(auVar73);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar24;
    _local_1348 = auVar20 << 0x20;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_4_ = 0x7f800000;
    values[0]._12_4_ = 0x7f800000;
    values[0].lbounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[3] = INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[3] = INFINITY;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_4_ = 0xff800000;
    values[0]._92_4_ = 0xff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    uVar4 = vmovlps_avx(auVar73);
    values[1].lbounds.bounds0.upper.field_0.m128[1] = (undefined4)uVar4;
    values[1].lbounds.bounds0.upper.field_0.m128[2] = (undefined4)((ulong)uVar4 >> 0x20);
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    auVar19._4_4_ = 0;
    auVar19._0_4_ = csplit.field_2.pos;
    auVar19._8_8_ = csplit.mapping.num;
    vSplitPos.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vpermilps_avx(auVar19,0);
    isLeft.vSplitPos = &vSplitPos;
    lVar35 = (long)(1 << ((byte)csplit.dim & 0x1f)) * 0x10;
    vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar35);
    vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar35 + 8);
    isLeft.vSplitMask = &vSplitMask;
    isLeft.split = &csplit;
    local_15a8 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                           (((current->prims).prims)->items,begin_00,sVar33,(EmptyTy *)&vSplitPos_1,
                            (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lock,
                            (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,&isLeft,&reduction
                            ,&reduction2,0x80,0xc00);
    local_1578 = (BBox1f)(current->prims).prims;
    auVar48._8_8_ = 0;
    auVar48._0_4_ = (current->prims).super_PrimInfoMB.time_range.lower;
    auVar48._4_4_ = (current->prims).super_PrimInfoMB.time_range.upper;
    local_14e8._12_4_ = (float)lock._12_4_;
    local_14e8._8_4_ = (float)lock._8_4_;
    local_14e8._0_8_ = lock.mutex;
    uStack_14d8 = aStack_13b8._0_8_;
    uStack_14d0 = aStack_13b8._8_8_;
    local_14c8 = local_13a8;
    uStack_14c0 = uStack_13a0;
    uStack_14b8 = auStack_1398;
    uStack_14b0 = uStack_1390;
    local_14a8 = local_1388;
    uStack_14a0 = uStack_1380;
    uStack_1498 = auStack_1378._0_8_;
    uStack_1490 = stack0xffffffffffffec90;
    local_1478 = (size_t)auStack_1358;
    sStack_1470._0_4_ = BStack_1350.lower;
    sStack_1470._4_4_ = BStack_1350.upper;
    auVar58._8_8_ = 0;
    auVar58._0_4_ = aBStack_1340[0].lower;
    auVar58._4_4_ = aBStack_1340[0].upper;
    auVar47 = vcmpps_avx(auVar58,auVar48,1);
    auVar54 = vinsertps_avx(auVar48,auVar58,0x50);
    auVar55 = vinsertps_avx(auVar58,auVar48,0x50);
    auVar47 = vblendvps_avx(auVar55,auVar54,auVar47);
    auStack_1468._8_8_ = vmovlps_avx(auVar47);
    auStack_1468._0_8_ = local_1348;
    local_1618._24_8_ = CONCAT44(values[0]._12_4_,values[0]._8_4_);
    local_1618._16_8_ = values[0].ref.ptr;
    local_15f8.m128[1] = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
    local_15f8.m128[0] = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
    local_15f8.m128[3] = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
    local_15f8.m128[2] = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
    local_15e8.m128[1] = (float)values[0].lbounds.bounds0.upper.field_0._4_4_;
    local_15e8.m128[0] = (float)values[0].lbounds.bounds0.upper.field_0._0_4_;
    local_15e8.m128[3] = (float)values[0].lbounds.bounds0.upper.field_0._12_4_;
    local_15e8.m128[2] = (float)values[0].lbounds.bounds0.upper.field_0._8_4_;
    local_15d8.m128[1] = (float)values[0].lbounds.bounds1.lower.field_0._4_4_;
    local_15d8.m128[0] = (float)values[0].lbounds.bounds1.lower.field_0._0_4_;
    local_15d8.m128[3] = (float)values[0].lbounds.bounds1.lower.field_0._12_4_;
    local_15d8.m128[2] = (float)values[0].lbounds.bounds1.lower.field_0._8_4_;
    local_15c8.m128[1] = (float)values[0].lbounds.bounds1.upper.field_0._4_4_;
    local_15c8.m128[0] = (float)values[0].lbounds.bounds1.upper.field_0._0_4_;
    local_15c8.m128[3] = (float)values[0].lbounds.bounds1.upper.field_0._12_4_;
    local_15c8.m128[2] = (float)values[0].lbounds.bounds1.upper.field_0._8_4_;
    local_15b8._begin._4_4_ = values[0].dt.upper;
    local_15b8._begin._0_4_ = values[0].dt.lower;
    local_15b8._end._4_4_ = values[0]._92_4_;
    local_15b8._end._0_4_ = values[0]._88_4_;
    auStack_1588._4_4_ = values[1].lbounds.bounds0.upper.field_0.m128[1];
    auStack_1588._0_4_ = values[1].lbounds.bounds0.upper.field_0.m128[0];
    auVar59._4_4_ = values[1].lbounds.bounds0.upper.field_0.m128[3];
    auVar59._0_4_ = values[1].lbounds.bounds0.upper.field_0.m128[2];
    local_1598.lower = (float)values[1].lbounds.bounds0.lower.field_0._0_4_;
    local_1598.upper = (float)values[1].lbounds.bounds0.lower.field_0._4_4_;
    BStack_1590.lower = (float)values[1].lbounds.bounds0.lower.field_0._8_4_;
    BStack_1590.upper = (float)values[1].lbounds.bounds0.lower.field_0._12_4_;
    auVar59._8_8_ = 0;
    auVar47 = vcmpps_avx(auVar59,auVar48,1);
    auVar54 = vinsertps_avx(auVar48,auVar59,0x50);
    auVar55 = vinsertps_avx(auVar59,auVar48,0x50);
    auVar47 = vblendvps_avx(auVar55,auVar54,auVar47);
    auStack_1588._8_8_ = vmovlps_avx(auVar47);
    local_15a0 = sVar33;
    local_1488 = begin_00;
    sStack_1480 = local_15a8;
    local_1458 = local_1578;
LAB_0135176d:
    bVar44 = false;
  }
  else {
    if (csplit.data != 2) {
      if (csplit.data == 1) {
        SetMB::deterministic_order(local_19e0);
        splitFallback(this,set,(SetMB *)&local_14e8.field_1,(SetMB *)(local_1618 + 0x10));
      }
      else if (csplit.data == 3) {
        SetMB::deterministic_order(local_19e0);
        splitByGeometry(this,set,(SetMB *)&local_14e8.field_1,(SetMB *)(local_1618 + 0x10));
      }
      goto LAB_0135176d;
    }
    time_range0.upper = csplit.field_2.fpos;
    time_range1.upper = fVar46;
    time_range1.lower = csplit.field_2.fpos;
    BVar36 = (BBox1f)(current->prims).prims;
    time_range0.lower = fVar3;
    pmVar29 = (PrimRefVector)operator_new(0x28);
    pMVar10 = (this->heuristicTemporalSplit).device;
    (pmVar29->alloc).device = pMVar10;
    (pmVar29->alloc).hugepages = false;
    uVar39 = uVar24 * 0x50;
    pmVar29->size_active = 0;
    pmVar29->size_alloced = 0;
    pmVar29->items = (PrimRefMB *)0x0;
    (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,uVar39,0);
    if (uVar39 < 0x1c00000) {
      pPVar30 = (PrimRefMB *)alignedMalloc(uVar39,0x10);
    }
    else {
      pPVar30 = (PrimRefMB *)os_malloc(uVar39,&(pmVar29->alloc).hugepages);
    }
    aStack_1828._0_8_ = &this->heuristicTemporalSplit;
    pmVar29->items = pPVar30;
    pmVar29->size_active = uVar24;
    pmVar29->size_alloced = uVar24;
    aStack_1828._8_8_ = &lprims;
    local_1818._0_8_ = local_19e0;
    pSVar11 = (Split *)(current->prims).super_PrimInfoMB.object_range._begin;
    pvVar13 = (vint *)(current->prims).super_PrimInfoMB.object_range._end;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_4_ = 0x7f800000;
    values[0]._12_4_ = 0x7f800000;
    values[0].lbounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[3] = INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[3] = INFINITY;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_4_ = 0xff800000;
    values[0]._92_4_ = 0xff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    auVar54._8_4_ = 0x3f800000;
    auVar54._0_8_ = 0x3f8000003f800000;
    auVar54._12_4_ = 0x3f800000;
    uVar4 = vmovlps_avx(auVar54);
    values[1].lbounds.bounds0.upper.field_0.m128[1] = (undefined4)uVar4;
    values[1].lbounds.bounds0.upper.field_0.m128[2] = (undefined4)((ulong)uVar4 >> 0x20);
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    local_1a28 = pmVar29;
    lprims = pmVar29;
    vSplitMask.field_0._0_8_ = BVar36;
    vSplitMask.field_0._8_8_ = &time_range0;
    if ((ulong)((long)pvVar13 - (long)pSVar11) < 0xc00) {
      isLeft.split = pSVar11;
      isLeft.vSplitPos = pvVar13;
      ::anon_func::anon_class_40_5_808acc65::operator()
                ((PrimInfoMB *)&lock,(anon_class_40_5_808acc65 *)&vSplitMask,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
      tbb::detail::r1::initialize((task_group_context *)&isLeft);
      vSplitPos.field_0.v[1] = (longlong)pSVar11;
      vSplitPos.field_0.v[0] = (longlong)pvVar13;
      local_1768._0_8_ = (BBox1f *)0x80;
      _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lock,(d1 *)&vSplitPos,
                 (blocked_range<unsigned_long> *)values,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                 (anon_class_16_2_ed117de8_conflict29 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&isLeft,in_stack_ffffffffffffe5b8);
      cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar22 != '\0') {
        prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar34,"task cancelled");
        __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&isLeft);
    }
    uVar40 = (current->prims).super_PrimInfoMB.object_range._begin;
    pBVar38 = (BBox1f *)(current->prims).super_PrimInfoMB.object_range._end;
    uVar24 = (long)pBVar38 - uVar40;
    sStack_1480 = local_1368._end;
    local_1488 = local_1368._begin;
    if (local_1368._end - local_1368._begin != uVar24) {
      values[0].ref.ptr = (size_t)&time_range0;
      sStack_1480 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                              (lprims->items,0,uVar24,0x400,(anon_class_8_1_41ce32a5 *)values);
      local_1368._end = sStack_1480;
      uVar40 = (current->prims).super_PrimInfoMB.object_range._begin;
      pBVar38 = (BBox1f *)(current->prims).super_PrimInfoMB.object_range._end;
      uVar24 = (long)pBVar38 - uVar40;
      local_1488 = local_1368._begin;
    }
    auVar55._4_4_ = time_range0.upper;
    auVar55._0_4_ = time_range0.lower;
    auVar55._8_8_ = 0;
    local_14e8._12_4_ = (float)lock._12_4_;
    local_14e8._8_4_ = (float)lock._8_4_;
    local_1478 = (size_t)auStack_1358;
    sStack_1470._0_4_ = BStack_1350.lower;
    sStack_1470._4_4_ = BStack_1350.upper;
    local_14e8._0_8_ = lock.mutex;
    uStack_14d8 = aStack_13b8._0_8_;
    uStack_14d0 = aStack_13b8._8_8_;
    local_14c8 = local_13a8;
    uStack_14c0 = uStack_13a0;
    uStack_14b8 = auStack_1398;
    uStack_14b0 = uStack_1390;
    local_14a8 = local_1388;
    uStack_14a0 = uStack_1380;
    uStack_1498 = auStack_1378._0_8_;
    uStack_1490 = stack0xffffffffffffec90;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = local_1348;
    auVar72._8_8_ = 0;
    auVar72._0_4_ = aBStack_1340[0].lower;
    auVar72._4_4_ = aBStack_1340[0].upper;
    auVar47 = vcmpps_avx(auVar72,auVar55,1);
    auVar54 = vinsertps_avx(auVar55,auVar72,0x50);
    auVar55 = vinsertps_avx(auVar72,auVar55,0x50);
    auVar47 = vblendvps_avx(auVar55,auVar54,auVar47);
    auStack_1468 = vmovlhps_avx(auVar67,auVar47);
    local_1458 = (BBox1f)lprims;
    isLeft.split = (Split *)0x7f8000007f800000;
    isLeft.vSplitPos = (vint *)0x7f8000007f800000;
    isLeft.vSplitMask._0_4_ = 0xff800000;
    isLeft.vSplitMask._4_4_ = 0xff800000;
    uStack_1990 = -INFINITY;
    uStack_198c = -INFINITY;
    uStack_1980._0_4_ = INFINITY;
    auStack_1988 = (undefined1  [8])0x7f8000007f800000;
    uStack_1980._4_4_ = 0x7f800000;
    local_1978.m128[0] = -INFINITY;
    local_1978.m128[1] = -INFINITY;
    local_1978.m128[2] = -INFINITY;
    local_1978.m128[3] = -INFINITY;
    aStack_1968.m128[0] = INFINITY;
    aStack_1968.m128[1] = INFINITY;
    aStack_1968.m128[2] = INFINITY;
    aStack_1968.m128[3] = INFINITY;
    local_1958.lower = -INFINITY;
    local_1958.upper = -INFINITY;
    acStack_1950[0] = '\0';
    acStack_1950[1] = '\0';
    acStack_1950[2] = -0x80;
    acStack_1950[3] = -1;
    acStack_1950[4] = '\0';
    acStack_1950[5] = '\0';
    acStack_1950[6] = -0x80;
    acStack_1950[7] = -1;
    uStack_1948 = 0;
    uStack_1940 = 0;
    local_1938 = 0;
    sStack_1930 = 0;
    uStack_1928 = 0;
    auVar56._8_4_ = 0x3f800000;
    auVar56._0_8_ = 0x3f8000003f800000;
    auVar56._12_4_ = 0x3f800000;
    uVar4 = vmovlps_avx(auVar56);
    uStack_1924 = (undefined4)uVar4;
    uStack_1920 = (undefined4)((ulong)uVar4 >> 0x20);
    uStack_191c = 0;
    _reduction2 = BVar36;
    if (uVar24 < 0xc00) {
      vSplitPos.field_0.v[1] = (longlong)pBVar38;
      vSplitPos.field_0.v[0] = uVar40;
      ::anon_func::anon_class_24_3_35f68c7c::operator()
                ((PrimInfoMB *)values,(anon_class_24_3_35f68c7c *)&reduction2,
                 (range<unsigned_long> *)&vSplitPos);
    }
    else {
      vSplitPos.field_0.v[1]._4_2_ = 0x401;
      piStack_1758 = (intrusive_list_node *)0x0;
      piStack_1750 = (intrusive_list_node *)0x0;
      sStack_1738 = CUSTOM_CTX;
      tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
      vSplitPos_1.field_0.v[1] = (longlong)&reduction2;
      vSplitPos_1.field_0.v[0] = (longlong)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      _reduction = (code *)pBVar38;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&isLeft,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitPos_1,
                 (anon_class_16_2_ed117de8_conflict30 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&vSplitPos,in_stack_ffffffffffffe5b8);
      cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
      if (cVar22 != '\0') {
        prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar34,"task cancelled");
        __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
    }
    lVar35 = values[1]._8_8_ - values[1].ref.ptr;
    values[1].ref.ptr = (current->prims).super_PrimInfoMB.object_range._begin;
    local_15a0 = lVar35 + values[1].ref.ptr;
    values[1]._8_8_ = local_15a0;
    uVar40 = (current->prims).super_PrimInfoMB.object_range._end;
    if (lVar35 != uVar40 - values[1].ref.ptr) {
      isLeft.split = (Split *)&time_range1;
      local_15a0 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                             ((PrimRefMB *)
                              ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar36 + 0x20))->
                              reduction,values[1].ref.ptr,uVar40,0x400,
                              (anon_class_8_1_41ce32a6 *)&isLeft);
      values[1]._8_8_ = local_15a0;
    }
    auVar83._8_8_ = 0;
    auVar83._0_4_ = time_range1.lower;
    auVar83._4_4_ = time_range1.upper;
    local_1618._16_8_ = values[0].ref.ptr;
    local_1618._24_8_ = CONCAT44(values[0]._12_4_,values[0]._8_4_);
    local_15f8.m128[1] = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
    local_15f8.m128[0] = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
    local_15f8.m128[2] = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
    local_15f8.m128[3] = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
    local_15e8.m128[1] = (float)values[0].lbounds.bounds0.upper.field_0._4_4_;
    local_15e8.m128[0] = (float)values[0].lbounds.bounds0.upper.field_0._0_4_;
    local_15e8.m128[2] = (float)values[0].lbounds.bounds0.upper.field_0._8_4_;
    local_15e8.m128[3] = (float)values[0].lbounds.bounds0.upper.field_0._12_4_;
    local_15d8.m128[1] = (float)values[0].lbounds.bounds1.lower.field_0._4_4_;
    local_15d8.m128[0] = (float)values[0].lbounds.bounds1.lower.field_0._0_4_;
    local_15d8.m128[2] = (float)values[0].lbounds.bounds1.lower.field_0._8_4_;
    local_15d8.m128[3] = (float)values[0].lbounds.bounds1.lower.field_0._12_4_;
    local_15c8.m128[1] = (float)values[0].lbounds.bounds1.upper.field_0._4_4_;
    local_15c8.m128[0] = (float)values[0].lbounds.bounds1.upper.field_0._0_4_;
    local_15c8.m128[2] = (float)values[0].lbounds.bounds1.upper.field_0._8_4_;
    local_15c8.m128[3] = (float)values[0].lbounds.bounds1.upper.field_0._12_4_;
    local_15b8._begin._4_4_ = values[0].dt.upper;
    local_15b8._begin._0_4_ = values[0].dt.lower;
    local_15b8._end._0_4_ = values[0]._88_4_;
    local_15b8._end._4_4_ = values[0]._92_4_;
    local_1598.lower = (float)values[1].lbounds.bounds0.lower.field_0._0_4_;
    local_1598.upper = (float)values[1].lbounds.bounds0.lower.field_0._4_4_;
    BStack_1590.lower = (float)values[1].lbounds.bounds0.lower.field_0._8_4_;
    BStack_1590.upper = (float)values[1].lbounds.bounds0.lower.field_0._12_4_;
    auVar86._4_4_ = values[1].lbounds.bounds0.upper.field_0.m128[1];
    auVar86._0_4_ = values[1].lbounds.bounds0.upper.field_0.m128[0];
    auVar86._8_8_ = 0;
    auVar89._4_4_ = values[1].lbounds.bounds0.upper.field_0.m128[3];
    auVar89._0_4_ = values[1].lbounds.bounds0.upper.field_0.m128[2];
    auVar89._8_8_ = 0;
    auVar47 = vcmpps_avx(auVar89,auVar83,1);
    auVar54 = vinsertps_avx(auVar83,auVar89,0x50);
    auVar55 = vinsertps_avx(auVar89,auVar83,0x50);
    auVar47 = vblendvps_avx(auVar55,auVar54,auVar47);
    auStack_1588 = vmovlhps_avx(auVar86,auVar47);
    bVar44 = local_1a28 != (PrimRefVector)0x0;
    local_15a8 = values[1].ref.ptr;
    local_1578 = BVar36;
    values[1]._8_8_ = local_15a0;
  }
  auVar47 = auStack_1468;
  lVar35 = 1;
  local_640 = 1;
  local_840 = (BBox1f)(current->prims).prims;
  uStack_13a0 = uStack_14d0;
  local_13a8 = (undefined1  [8])uStack_14d8;
  uStack_1390 = uStack_14c0;
  auStack_1398 = (undefined1  [8])local_14c8;
  uStack_1380 = uStack_14b0;
  local_1388 = (undefined1  [8])uStack_14b8;
  unique0x1000439f = uStack_14a0;
  auStack_1378._0_8_ = local_14a8;
  local_1368._end = uStack_1490;
  local_1368._begin = uStack_1498;
  BStack_1350 = (BBox1f)sStack_1480;
  auStack_1358 = (undefined1  [8])local_1488;
  local_1a28 = (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                *)0x0;
  if (local_1458 == local_840) {
    local_838 = 3;
    local_8c8[0] = &local_840;
  }
  else {
    local_640 = 2;
    local_830 = local_1458;
    local_828 = 1;
    local_838 = 2;
    lVar35 = 2;
    local_8c8[0] = &local_830;
  }
  lock.mutex = (MutexSys *)(current->depth + 1);
  if (local_1578 == local_840) {
    local_8c8[1] = &local_840;
  }
  else {
    local_640 = lVar35 + 1;
    uVar24 = (ulong)(uint)((int)lVar35 << 4);
    *(BBox1f *)((long)&local_840.lower + uVar24) = local_1578;
    *(undefined8 *)((long)&local_838 + uVar24) = 1;
    local_8c8[1] = (BBox1f *)((long)&local_840.lower + uVar24);
    local_838 = local_838 + -1;
  }
  aStack_13b8._0_8_ = local_14e8._0_8_;
  aStack_13b8._8_8_ = local_14e8._8_8_;
  aBStack_1340[0] = (BBox1f)sStack_1470;
  local_1348 = (undefined1  [8])local_1478;
  aBStack_1340[1].lower = (float)auStack_1468._0_4_;
  aBStack_1340[1].upper = (float)auStack_1468._4_4_;
  uStack_1330 = auStack_1468._8_8_;
  local_1328[0] = local_1458;
  local_1318 = lock.mutex;
  local_1308 = local_1618._16_8_;
  uStack_1300 = local_1618._24_8_;
  local_12f8 = local_15f8;
  local_12e8 = local_15e8;
  local_12d8 = local_15d8;
  local_12c8 = local_15c8;
  local_12b8 = local_15b8;
  local_12a8 = local_15a8;
  local_12a0 = local_15a0;
  local_1298 = local_1598;
  BStack_1290 = BStack_1590;
  local_1288 = auStack_1588;
  local_1278 = local_1578;
  local_848 = 2;
  auStack_1468 = auVar47;
  if (2 < (this->cfg).branchingFactor) {
    local_1a08._0_8_ = &this->heuristicTemporalSplit;
    local_19d8._0_8_ = &uStack_1928;
    local_19f8._0_8_ = &sStack_16f8;
    do {
      if (local_848 == 0) break;
      uVar24 = 0xffffffffffffffff;
      plVar23 = (long *)(auStack_1358 + 8);
      fVar46 = -INFINITY;
      uVar39 = 0;
      do {
        if ((this->cfg).minLeafSize < (ulong)(*plVar23 - plVar23[-1])) {
          auVar55 = vsubps_avx(*(undefined1 (*) [16])(plVar23 + -0xb),
                               *(undefined1 (*) [16])(plVar23 + -0xd));
          auVar56 = vsubps_avx(*(undefined1 (*) [16])(plVar23 + -7),
                               *(undefined1 (*) [16])(plVar23 + -9));
          auVar47 = vinsertps_avx(auVar56,auVar55,0x4c);
          auVar54 = vshufpd_avx(auVar55,auVar55,1);
          auVar54 = vinsertps_avx(auVar54,auVar56,0x9c);
          auVar55 = vinsertps_avx(auVar55,auVar56,0x1c);
          auVar60._0_4_ =
               auVar55._0_4_ * (auVar47._0_4_ + auVar54._0_4_) + auVar47._0_4_ * auVar54._0_4_;
          auVar60._4_4_ =
               auVar55._4_4_ * (auVar47._4_4_ + auVar54._4_4_) + auVar47._4_4_ * auVar54._4_4_;
          auVar60._8_4_ =
               auVar55._8_4_ * (auVar47._8_4_ + auVar54._8_4_) + auVar47._8_4_ * auVar54._8_4_;
          auVar60._12_4_ =
               auVar55._12_4_ * (auVar47._12_4_ + auVar54._12_4_) + auVar47._12_4_ * auVar54._12_4_;
          auVar47 = vhaddps_avx(auVar60,auVar60);
          fVar3 = auVar47._0_4_ * 0.5;
          if (fVar46 < fVar3) {
            uVar24 = uVar39;
            fVar46 = fVar3;
          }
        }
        uVar39 = uVar39 + 1;
        plVar23 = plVar23 + 0x16;
      } while (local_848 != uVar39);
      if (uVar24 == 0xffffffffffffffff) break;
      lVar35 = uVar24 * 0xb0;
      isLeft.split = (Split *)(current->depth + 1);
      vSplitPos.field_0.v[0] = (longlong)isLeft.split;
      paVar31 = &aStack_13b8 + uVar24 * 0xb;
      find((Split *)&time_range0,this,(SetMB *)&paVar31->field_1);
      if (uStack_143c == 0) {
        local_1938 = *(size_t *)(auStack_1358 + lVar35);
        sVar33 = *(size_t *)(auStack_1358 + lVar35 + 8);
        vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
        vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
        aStack_1828._0_8_ = (Lock<embree::MutexSys> *)0xff800000ff800000;
        aStack_1828._8_8_ = (PrimRefVector *)0xff800000ff800000;
        local_1818._0_8_ = (SetMB *)0x7f8000007f800000;
        local_1818.i[2] = 0x7f800000;
        local_1818.i[3] = 0x7f800000;
        aStack_1808.i[0] = -0x800000;
        aStack_1808.i[1] = -0x800000;
        aStack_1808.i[2] = -0x800000;
        aStack_1808.i[3] = -0x800000;
        local_17f8.m128[0] = INFINITY;
        local_17f8.m128[1] = INFINITY;
        local_17f8.m128[2] = INFINITY;
        local_17f8.m128[3] = INFINITY;
        aStack_17e8.m128[0] = -INFINITY;
        aStack_17e8.m128[1] = -INFINITY;
        aStack_17e8.m128[2] = -INFINITY;
        aStack_17e8.m128[3] = -INFINITY;
        local_17b8 = 0.0;
        local_17d8 = 0;
        sStack_17d0 = 0;
        sStack_17c8 = 0;
        sStack_17c0 = 0;
        auVar74._8_4_ = 0x3f800000;
        auVar74._0_8_ = 0x3f8000003f800000;
        auVar74._12_4_ = 0x3f800000;
        lVar26 = vmovlps_avx(auVar74);
        fStack_17b4 = (float)lVar26;
        fStack_17b0 = (float)((ulong)lVar26 >> 0x20);
        fStack_17ac = 0.0;
        _reduction = (code *)0x7f8000007f800000;
        uVar39 = vmovlps_avx(auVar74);
        auVar18._4_4_ = 0;
        auVar18._0_4_ = local_1440.pos;
        auVar18._8_8_ = sStack_1438;
        vSplitPos_1.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vpermilps_avx(auVar18,0);
        time_range1 = *(BBox1f *)
                       (mm_lookupmask_ps + (long)(1 << (time_range0.upper._0_1_ & 0x1f)) * 0x10);
        _reduction2 = &time_range0;
        sStack_1930 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                (*(PrimRefMB **)((long)local_1328[uVar24 * 0x16] + 0x20),local_1938,
                                 sVar33,(EmptyTy *)local_1618,
                                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                                 (anon_class_24_3_c5d13451 *)&reduction2,
                                 (anon_class_1_0_00000001 *)&lprims,&reduction2_1,0x80,0xc00);
        local_1908 = local_1328[uVar24 * 0x16];
        auVar49._8_8_ = 0;
        auVar49._0_4_ = local_1328[uVar24 * 0x16 + -1].lower;
        auVar49._4_4_ = local_1328[uVar24 * 0x16 + -1].upper;
        local_1958.lower = INFINITY;
        local_1958.upper = INFINITY;
        acStack_1950[0] = '\0';
        acStack_1950[1] = '\0';
        acStack_1950[2] = -0x80;
        acStack_1950[3] = '\x7f';
        acStack_1950[4] = '\0';
        acStack_1950[5] = '\0';
        acStack_1950[6] = -0x80;
        acStack_1950[7] = '\x7f';
        uStack_1948 = 0xff800000ff800000;
        uStack_1940 = 0xff800000ff800000;
        uStack_1990 = (undefined4)vSplitMask.field_0._8_8_;
        uStack_198c = (undefined4)((ulong)vSplitMask.field_0._8_8_ >> 0x20);
        uStack_1980 = 0xff800000ff800000;
        auStack_1988 = (undefined1  [8])0xff800000ff800000;
        local_1978.m128[0] = INFINITY;
        local_1978.m128[1] = INFINITY;
        local_1978.m128[2] = INFINITY;
        local_1978.m128[3] = INFINITY;
        aStack_1968.m128[0] = -INFINITY;
        aStack_1968.m128[1] = -INFINITY;
        aStack_1968.m128[2] = -INFINITY;
        aStack_1968.m128[3] = -INFINITY;
        *(undefined8 *)local_19d8._0_8_ = 0;
        *(undefined8 *)(local_19d8._0_8_ + 8) = 0;
        *(long *)(local_19d8._0_8_ + 0x10) = lVar26 << 0x20;
        *(ulong *)(local_19d8._0_8_ + 0x18) = (ulong)(uint)fStack_17b0;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = auStack_1918._8_8_;
        auVar47 = vcmpps_avx(auVar61,auVar49,1);
        auVar54 = vinsertps_avx(auVar49,auVar61,0x50);
        auVar55 = vinsertps_avx(auVar61,auVar49,0x50);
        auVar47 = vblendvps_avx(auVar55,auVar54,auVar47);
        uVar4 = vmovlps_avx(auVar47);
        auStack_1918._8_8_ = uVar4;
        local_1768._0_8_ = _reduction;
        local_1768._8_8_ = 0x7f8000007f800000;
        piStack_1750 = (intrusive_list_node *)0xff800000ff800000;
        piStack_1758 = (intrusive_list_node *)0xff800000ff800000;
        local_1748._M_b._M_p = (__base_type)(__pointer_type)0x7f8000007f800000;
        pvStack_1740 = (void *)0x7f8000007f800000;
        sStack_1738 = 0xff800000ff800000;
        acStack_1730[0] = '\0';
        acStack_1730[1] = '\0';
        acStack_1730[2] = -0x80;
        acStack_1730[3] = -1;
        acStack_1730[4] = '\0';
        acStack_1730[5] = '\0';
        acStack_1730[6] = -0x80;
        acStack_1730[7] = -1;
        local_1728[0] = '\0';
        local_1728[1] = '\0';
        local_1728[2] = -0x80;
        local_1728[3] = '\x7f';
        local_1728[4] = '\0';
        local_1728[5] = '\0';
        local_1728[6] = -0x80;
        local_1728[7] = '\x7f';
        acStack_1720[0] = '\0';
        acStack_1720[1] = '\0';
        acStack_1720[2] = -0x80;
        acStack_1720[3] = '\x7f';
        acStack_1720[4] = '\0';
        acStack_1720[5] = '\0';
        acStack_1720[6] = -0x80;
        acStack_1720[7] = '\x7f';
        uStack_1718 = 0xff800000ff800000;
        uStack_1710 = 0xff800000ff800000;
        *(undefined8 *)local_19f8._0_8_ = 0;
        *(undefined8 *)(local_19f8._0_8_ + 8) = 0;
        *(ulong *)(local_19f8._0_8_ + 0x10) = uVar39 << 0x20;
        *(ulong *)(local_19f8._0_8_ + 0x18) = uVar39 >> 0x20;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = auStack_16e8._8_8_;
        auVar47 = vcmpps_avx(auVar62,auVar49,1);
        auVar54 = vinsertps_avx(auVar49,auVar62,0x50);
        auVar55 = vinsertps_avx(auVar62,auVar49,0x50);
        auVar47 = vblendvps_avx(auVar55,auVar54,auVar47);
        uVar4 = vmovlps_avx(auVar47);
        auStack_16e8._8_8_ = uVar4;
        bVar45 = false;
        uVar39 = uVar24;
        local_1708 = sStack_1930;
        sStack_1700 = sVar33;
        local_16d8 = local_1908;
        isLeft.vSplitMask = (vbool *)vSplitMask.field_0._0_8_;
      }
      else {
        local_19c8 = uVar24;
        if (uStack_143c == 2) {
          time_range0_1.lower = local_1328[uVar24 * 0x16 + -1].lower;
          time_range0_1.upper = local_1440.fpos;
          time_range1_1.lower = local_1440.fpos;
          time_range1_1.upper = local_1328[uVar24 * 0x16 + -1].upper;
          local_1a18.m128[0] = local_1328[uVar24 * 0x16].lower;
          local_1a18.m128[1] = local_1328[uVar24 * 0x16].upper;
          BVar25 = (BBox1f)operator_new(0x28);
          puVar6 = *(undefined8 **)local_1a08._0_8_;
          BVar36 = *(BBox1f *)(auStack_1358 + lVar35 + 8);
          *(undefined8 **)BVar25 = puVar6;
          *(undefined1 *)((long)BVar25 + 8) = 0;
          *(undefined8 *)((long)BVar25 + 0x10) = 0;
          *(undefined8 *)((long)BVar25 + 0x18) = 0;
          *(undefined8 *)((long)BVar25 + 0x20) = 0;
          lVar26 = (long)BVar36 - *(long *)(auStack_1358 + lVar35);
          BVar43 = BVar36;
          if (lVar26 != 0) {
            uVar39 = lVar26 * 0x50;
            (**(code **)*puVar6)(puVar6,uVar39,0);
            if (uVar39 < 0x1c00000) {
              pvVar27 = alignedMalloc(uVar39,0x10);
            }
            else {
              pvVar27 = os_malloc(uVar39,(bool *)((long)BVar25 + 8));
            }
            *(void **)((long)BVar25 + 0x20) = pvVar27;
            *(long *)((long)BVar25 + 0x10) = lVar26;
            *(long *)((long)BVar25 + 0x18) = lVar26;
            BVar43 = *(BBox1f *)(auStack_1358 + lVar35);
            BVar36 = *(BBox1f *)(auStack_1358 + lVar35 + 8);
          }
          aVar65 = local_1a18;
          time_range1.lower = local_1a18.m128[0];
          time_range1.upper = local_1a18.m128[1];
          _reduction = (code *)0x7f8000007f800000;
          auVar50._8_4_ = 0x3f800000;
          auVar50._0_8_ = 0x3f8000003f800000;
          auVar50._12_4_ = 0x3f800000;
          lVar26 = vmovlps_avx(auVar50);
          fStack_1850 = (float)((ulong)lVar26 >> 0x20);
          local_1a20 = BVar25;
          local_1a18 = aVar65;
          if ((ulong)((long)BVar36 - (long)BVar43) < 0xc00) {
            _reduction2 = BVar43;
            ::anon_func::anon_class_40_5_808acc65::operator()
                      ((PrimInfoMB *)&vSplitMask,(anon_class_40_5_808acc65 *)&time_range1,
                       (range<unsigned_long> *)&reduction2);
          }
          else {
            tbb::detail::r1::initialize((task_group_context *)&reduction2);
            vSplitPos_1.field_0._8_4_ = BVar43.lower;
            vSplitPos_1.field_0._12_4_ = BVar43.upper;
            vSplitPos_1.field_0._0_4_ = BVar36.lower;
            vSplitPos_1.field_0._4_4_ = BVar36.upper;
            lprims = (PrimRefVector)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
            local_18e8 = &time_range1;
            tbb::detail::d1::
            parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                      ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,(d1 *)&vSplitPos_1
                       ,(blocked_range<unsigned_long> *)&reduction,
                       (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lprims,
                       (anon_class_16_2_ed117de8_conflict29 *)
                       PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                       (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                        *)&reduction2,in_stack_ffffffffffffe5b8);
            cVar22 = tbb::detail::r1::is_group_execution_cancelled
                               ((task_group_context *)&reduction2);
            if (cVar22 != '\0') {
              prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar34,"task cancelled");
              __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            tbb::detail::r1::destroy((task_group_context *)&reduction2);
          }
          pBVar38 = *(BBox1f **)(auStack_1358 + lVar35);
          pmVar29 = *(PrimRefVector *)(auStack_1358 + lVar35 + 8);
          uVar39 = (long)pmVar29 - (long)pBVar38;
          if (sStack_17d0 - local_17d8 != uVar39) {
            _reduction = (code *)&time_range0_1;
            sStack_17d0 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                    (*(PrimRefMB **)((long)BVar25 + 0x20),0,uVar39,0x400,
                                     (anon_class_8_1_41ce32a5 *)&reduction);
            pBVar38 = *(BBox1f **)(auStack_1358 + lVar35);
            pmVar29 = *(PrimRefVector *)(auStack_1358 + lVar35 + 8);
            uVar39 = (long)pmVar29 - (long)pBVar38;
          }
          vVar21.field_0 = vSplitPos_1.field_0;
          auVar51._4_4_ = time_range0_1.upper;
          auVar51._0_4_ = time_range0_1.lower;
          auVar51._8_8_ = 0;
          local_1958.upper = local_17f8.m128[1];
          local_1958.lower = local_17f8.m128[0];
          acStack_1950._4_4_ = local_17f8.m128[3];
          acStack_1950._0_4_ = local_17f8.m128[2];
          uStack_1948 = CONCAT44(aStack_17e8.m128[1],aStack_17e8.m128[0]);
          uStack_1940 = CONCAT44(aStack_17e8.m128[3],aStack_17e8.m128[2]);
          *(size_t *)local_19d8._0_8_ = sStack_17c8;
          *(size_t *)(local_19d8._0_8_ + 8) = sStack_17c0;
          isLeft.vSplitMask._0_4_ = (undefined4)vSplitMask.field_0._0_8_;
          isLeft.vSplitMask._4_4_ = (undefined4)((ulong)vSplitMask.field_0._0_8_ >> 0x20);
          uStack_1990 = (undefined4)vSplitMask.field_0._8_8_;
          uStack_198c = (undefined4)((ulong)vSplitMask.field_0._8_8_ >> 0x20);
          uStack_1980 = aStack_1828._8_8_;
          auStack_1988 = (undefined1  [8])aStack_1828._0_8_;
          local_1978.m128[0] = (float)local_1818._0_8_;
          local_1978.m128[1] = (float)((ulong)local_1818._0_8_ >> 0x20);
          local_1978.m128[2] = (float)local_1818.i[2];
          local_1978.m128[3] = (float)local_1818.i[3];
          aStack_1968.m128[0] = (float)aStack_1808.i[0];
          aStack_1968.m128[1] = (float)aStack_1808.i[1];
          aStack_1968.m128[2] = (float)aStack_1808.i[2];
          aStack_1968.m128[3] = (float)aStack_1808.i[3];
          local_1938 = local_17d8;
          auVar63._4_4_ = fStack_17b4;
          auVar63._0_4_ = local_17b8;
          auVar63._8_8_ = 0;
          auVar68._4_4_ = fStack_17ac;
          auVar68._0_4_ = fStack_17b0;
          auVar68._8_8_ = 0;
          auVar47 = vcmpps_avx(auVar68,auVar51,1);
          auVar54 = vinsertps_avx(auVar51,auVar68,0x50);
          auVar55 = vinsertps_avx(auVar68,auVar51,0x50);
          auVar47 = vblendvps_avx(auVar55,auVar54,auVar47);
          auStack_1918 = vmovlhps_avx(auVar63,auVar47);
          _reduction2_1 = (mvector<embree::PrimRefMB> *)local_1a18._0_8_;
          _reduction2 = INFINITY;
          uStack_16c4 = INFINITY;
          auVar52._8_4_ = 0x3f800000;
          auVar52._0_8_ = 0x3f8000003f800000;
          auVar52._12_4_ = 0x3f800000;
          vmovlps_avx(auVar52);
          local_1908 = BVar25;
          if (uVar39 < 0xc00) {
            vSplitPos_1.field_0.v[1] = (longlong)pmVar29;
            vSplitPos_1.field_0.v[0] = (longlong)pBVar38;
            ::anon_func::anon_class_24_3_35f68c7c::operator()
                      ((PrimInfoMB *)&reduction,(anon_class_24_3_35f68c7c *)&reduction2_1,
                       (range<unsigned_long> *)&vSplitPos_1);
          }
          else {
            vSplitPos_1.field_0.v[1]._4_1_ = 1;
            vSplitPos_1.field_0.v[1]._6_2_ = vVar21.field_0._14_2_;
            vSplitPos_1.field_0.v[1]._5_1_ = 4;
            tbb::detail::r1::initialize((task_group_context *)&vSplitPos_1);
            local_18e0 = (undefined1  [8])0x80;
            local_1618._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
            local_1618._8_8_ = &reduction2_1;
            lprims = pmVar29;
            local_18e8 = pBVar38;
            tbb::detail::d1::
            parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                      ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,(d1 *)&lprims,
                       (blocked_range<unsigned_long> *)&reduction2,
                       (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1618,
                       (anon_class_16_2_ed117de8_conflict30 *)
                       PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                       (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                        *)&vSplitPos_1,in_stack_ffffffffffffe5b8);
            cVar22 = tbb::detail::r1::is_group_execution_cancelled
                               ((task_group_context *)&vSplitPos_1);
            if (cVar22 != '\0') {
              prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar34,"task cancelled");
              __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            tbb::detail::r1::destroy((task_group_context *)&vSplitPos_1);
          }
          uVar39 = local_19c8;
          uVar40 = *(unsigned_long *)(auStack_1358 + lVar35);
          uVar28 = uVar40;
          if (*(unsigned_long *)(auStack_1358 + lVar35 + 8) != uVar40) {
            _reduction2 = &time_range1_1;
            uVar28 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (*(PrimRefMB **)(local_1a18._0_8_ + 0x20),uVar40,
                                *(unsigned_long *)(auStack_1358 + lVar35 + 8),0x400,
                                (anon_class_8_1_41ce32a6 *)&reduction2);
          }
          aVar65 = local_1a18;
          auVar53._4_4_ = time_range1_1.upper;
          auVar53._0_4_ = time_range1_1.lower;
          auVar53._8_8_ = 0;
          local_1768._0_8_ = _reduction;
          local_1768._8_8_ = 0x7f8000007f800000;
          piStack_1758 = (intrusive_list_node *)0xff800000ff800000;
          piStack_1750 = (intrusive_list_node *)0xff800000ff800000;
          local_1748._M_b._M_p = (__base_type)(__pointer_type)0x7f8000007f800000;
          pvStack_1740 = (void *)0x7f8000007f800000;
          sStack_1738 = 0xff800000ff800000;
          acStack_1730[0] = '\0';
          acStack_1730[1] = '\0';
          acStack_1730[2] = -0x80;
          acStack_1730[3] = -1;
          acStack_1730[4] = '\0';
          acStack_1730[5] = '\0';
          acStack_1730[6] = -0x80;
          acStack_1730[7] = -1;
          local_1728[0] = '\0';
          local_1728[1] = '\0';
          local_1728[2] = -0x80;
          local_1728[3] = '\x7f';
          local_1728[4] = '\0';
          local_1728[5] = '\0';
          local_1728[6] = -0x80;
          local_1728[7] = '\x7f';
          acStack_1720[0] = '\0';
          acStack_1720[1] = '\0';
          acStack_1720[2] = -0x80;
          acStack_1720[3] = '\x7f';
          acStack_1720[4] = '\0';
          acStack_1720[5] = '\0';
          acStack_1720[6] = -0x80;
          acStack_1720[7] = '\x7f';
          uStack_1718 = 0xff800000ff800000;
          uStack_1710 = 0xff800000ff800000;
          *(undefined8 *)local_19f8._0_8_ = 0;
          *(undefined8 *)(local_19f8._0_8_ + 8) = 0;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = lVar26 << 0x20;
          auVar55 = ZEXT416((uint)fStack_1850);
          auVar47 = vcmpps_avx(auVar55,auVar53,1);
          auVar54 = vinsertps_avx(auVar53,auVar55,0x50);
          auVar55 = vinsertps_avx(auVar55,auVar53,0x50);
          auVar47 = vblendvps_avx(auVar55,auVar54,auVar47);
          auStack_16e8 = vmovlhps_avx(auVar64,auVar47);
          local_16d8.lower = local_1a18.m128[0];
          local_16d8.upper = local_1a18.m128[1];
          bVar45 = local_1a20 != (BBox1f)0x0;
          local_1a18 = aVar65;
          sStack_1930 = sStack_17d0;
          local_1708 = uVar40;
          sStack_1700 = uVar28;
        }
        else {
          if (uStack_143c == 1) {
            SetMB::deterministic_order((SetMB *)&paVar31->field_1);
            splitFallback(this,(SetMB *)&paVar31->field_1,(SetMB *)&isLeft.vSplitMask,
                          (SetMB *)&local_1768.field_1);
          }
          else if (uStack_143c == 3) {
            SetMB::deterministic_order((SetMB *)&paVar31->field_1);
            splitByGeometry(this,(SetMB *)&paVar31->field_1,(SetMB *)&isLeft.vSplitMask,
                            (SetMB *)&local_1768.field_1);
          }
          bVar45 = false;
          uVar39 = local_19c8;
        }
      }
      lVar26 = local_640;
      local_1a20.lower = 0.0;
      local_1a20.upper = 0.0;
      pBVar38 = local_8c8[uVar39];
      if (local_1908 == *pBVar38) {
        pBVar38[1] = (BBox1f)((long)pBVar38[1] + 1);
        BVar36 = local_1908;
      }
      else {
        local_640 = local_640 + 1;
        (&local_840)[lVar26 * 2] = local_1908;
        (&local_838)[lVar26 * 2] = 1;
        local_8c8[uVar39] = &local_840 + lVar26 * 2;
        BVar36 = *pBVar38;
      }
      lVar26 = local_640;
      if (local_16d8 == BVar36) {
        local_8c8[local_848] = pBVar38;
        BVar36 = pBVar38[1];
        pBVar38[1] = (BBox1f)((long)BVar36 + 1);
      }
      else {
        local_640 = local_640 + 1;
        (&local_840)[lVar26 * 2] = local_16d8;
        (&local_838)[lVar26 * 2] = 1;
        local_8c8[local_848] = &local_840 + lVar26 * 2;
        BVar36 = (BBox1f)((long)pBVar38[1] + -1);
      }
      pBVar38[1] = BVar36;
      if (BVar36 == (BBox1f)0x0) {
        BVar36 = *pBVar38;
        if (BVar36 != (BBox1f)0x0) {
          lVar26 = *(long *)((long)BVar36 + 0x18);
          pvVar27 = *(void **)((long)BVar36 + 0x20);
          if (pvVar27 != (void *)0x0) {
            if ((ulong)(lVar26 * 0x50) < 0x1c00000) {
              alignedFree(pvVar27);
            }
            else {
              os_free(pvVar27,lVar26 * 0x50,*(bool *)((long)BVar36 + 8));
            }
          }
          if (lVar26 != 0) {
            (**(code **)**(undefined8 **)BVar36)(*(undefined8 **)BVar36,lVar26 * -0x50,1);
          }
          *(undefined8 *)((long)BVar36 + 0x10) = 0;
          *(undefined8 *)((long)BVar36 + 0x18) = 0;
          *(undefined8 *)((long)BVar36 + 0x20) = 0;
        }
        operator_delete((void *)BVar36);
      }
      auVar54 = auStack_16e8;
      auVar47 = auStack_1918;
      (&lock)[uVar24 * 0xb].mutex = (MutexSys *)isLeft.split;
      *(vbool **)(&aStack_13b8 + uVar24 * 0xb) = isLeft.vSplitMask;
      *(ulong *)(local_13a8 + lVar35 + -8) = CONCAT44(uStack_198c,uStack_1990);
      *(undefined1 (*) [8])(local_13a8 + lVar35) = auStack_1988;
      *(undefined8 *)(local_13a8 + lVar35 + 8) = uStack_1980;
      *(ulong *)(auStack_1398 + lVar35) = CONCAT44(local_1978.m128[1],local_1978.m128[0]);
      *(ulong *)(auStack_1398 + lVar35 + 8) = CONCAT44(local_1978.m128[3],local_1978.m128[2]);
      *(ulong *)(local_1388 + lVar35) = CONCAT44(aStack_1968.m128[1],aStack_1968.m128[0]);
      *(ulong *)(local_1388 + lVar35 + 8) = CONCAT44(aStack_1968.m128[3],aStack_1968.m128[2]);
      *(BBox1f *)(auStack_1378 + lVar35) = local_1958;
      *(char (*) [8])(auStack_1378 + lVar35 + 8) = acStack_1950;
      (&local_1368)[uVar24 * 0xb]._begin = uStack_1948;
      (&local_1368)[uVar24 * 0xb]._end = uStack_1940;
      *(size_t *)(auStack_1358 + lVar35) = local_1938;
      *(size_t *)(auStack_1358 + lVar35 + 8) = sStack_1930;
      *(ulong *)(local_1348 + lVar35) = CONCAT44(uStack_1924,uStack_1928);
      *(ulong *)(local_1348 + lVar35 + 8) = CONCAT44(uStack_191c,uStack_1920);
      aBStack_1340[uVar24 * 0x16 + 1].lower = (float)auStack_1918._0_4_;
      aBStack_1340[uVar24 * 0x16 + 1].upper = (float)auStack_1918._4_4_;
      local_1328[uVar24 * 0x16 + -1].lower = (float)auStack_1918._8_4_;
      local_1328[uVar24 * 0x16 + -1].upper = (float)auStack_1918._12_4_;
      local_1328[uVar24 * 0x16] = local_1908;
      uVar24 = local_848;
      lVar35 = local_848 * 0xb0;
      (&lock)[local_848 * 0xb].mutex = (MutexSys *)vSplitPos.field_0.v[0];
      *(undefined8 *)(&aStack_13b8 + uVar24 * 0xb) = local_1768._0_8_;
      *(undefined8 *)(local_13a8 + lVar35 + -8) = local_1768._8_8_;
      *(intrusive_list_node **)(local_13a8 + lVar35) = piStack_1758;
      *(intrusive_list_node **)(local_13a8 + lVar35 + 8) = piStack_1750;
      *(__base_type *)(auStack_1398 + lVar35) = local_1748._M_b._M_p;
      *(void **)(auStack_1398 + lVar35 + 8) = pvStack_1740;
      *(string_resource_index *)(local_1388 + lVar35) = sStack_1738;
      *(char (*) [8])(local_1388 + lVar35 + 8) = acStack_1730;
      *(char (*) [8])(auStack_1378 + lVar35) = local_1728;
      *(char (*) [8])(auStack_1378 + lVar35 + 8) = acStack_1720;
      (&local_1368)[uVar24 * 0xb]._begin = uStack_1718;
      (&local_1368)[uVar24 * 0xb]._end = uStack_1710;
      *(unsigned_long *)(auStack_1358 + lVar35) = local_1708;
      *(size_t *)(auStack_1358 + lVar35 + 8) = sStack_1700;
      *(size_t *)(local_1348 + lVar35) = sStack_16f8;
      *(undefined8 *)(local_1348 + lVar35 + 8) = uStack_16f0;
      aBStack_1340[uVar24 * 0x16 + 1].lower = (float)auStack_16e8._0_4_;
      aBStack_1340[uVar24 * 0x16 + 1].upper = (float)auStack_16e8._4_4_;
      local_1328[uVar24 * 0x16 + -1].lower = (float)auStack_16e8._8_4_;
      local_1328[uVar24 * 0x16 + -1].upper = (float)auStack_16e8._12_4_;
      local_1328[uVar24 * 0x16] = local_16d8;
      local_848 = local_848 + 1;
      auStack_1918 = auVar47;
      auStack_16e8 = auVar54;
      if (local_1a20 != (BBox1f)0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&local_1a20,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)local_1a20);
      }
      bVar44 = bVar44 | bVar45;
    } while (local_848 < (this->cfg).branchingFactor);
  }
  if (local_848 != 0) {
    puVar37 = &uStack_132c;
    uVar24 = local_848;
    do {
      auVar47 = vcmpps_avx(ZEXT416((uint)(current->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar37[-1]),1);
      auVar54 = vcmpps_avx(ZEXT416(*puVar37),
                           ZEXT416((uint)(current->prims).super_PrimInfoMB.time_range.upper),1);
      auVar47 = vorps_avx(auVar47,auVar54);
      bVar44 = bVar44 | auVar47[0];
      puVar37 = puVar37 + 0x2c;
      uVar24 = uVar24 - 1;
    } while (uVar24 != 0);
  }
  if ((bVar44 & 1) == 0) {
    _reduction = (code *)0xe0;
    pTVar7 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar7->alloc)._M_b._M_p) {
      vSplitPos.field_0.v[1]._0_1_ = 1;
      vSplitPos.field_0.v[0] = (longlong)pTVar7;
      MutexSys::lock(&pTVar7->mutex);
      if ((pTVar7->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar7->alloc1).bytesUsed + (pTVar7->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar7->alloc0).end + (pTVar7->alloc1).end) -
             ((pTVar7->alloc0).cur + (pTVar7->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar7->alloc1).bytesWasted + (pTVar7->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar57 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar7->alloc0).end = auVar57._0_8_;
      (pTVar7->alloc0).allocBlockSize = auVar57._8_8_;
      (pTVar7->alloc0).bytesUsed = auVar57._16_8_;
      (pTVar7->alloc0).bytesWasted = auVar57._24_8_;
      (pTVar7->alloc0).ptr = (char *)auVar57._0_8_;
      (pTVar7->alloc0).cur = auVar57._8_8_;
      (pTVar7->alloc0).end = auVar57._16_8_;
      (pTVar7->alloc0).allocBlockSize = auVar57._24_8_;
      auVar57 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar7->alloc1).end = auVar57._0_8_;
        (pTVar7->alloc1).allocBlockSize = auVar57._8_8_;
        (pTVar7->alloc1).bytesUsed = auVar57._16_8_;
        (pTVar7->alloc1).bytesWasted = auVar57._24_8_;
        (pTVar7->alloc1).ptr = (char *)auVar57._0_8_;
        (pTVar7->alloc1).cur = auVar57._8_8_;
        (pTVar7->alloc1).end = auVar57._16_8_;
        (pTVar7->alloc1).allocBlockSize = auVar57._24_8_;
      }
      else {
        (pTVar7->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar7->alloc1).ptr = (char *)auVar57._0_8_;
        (pTVar7->alloc1).cur = auVar57._8_8_;
        (pTVar7->alloc1).end = auVar57._16_8_;
        (pTVar7->alloc1).allocBlockSize = auVar57._24_8_;
        (pTVar7->alloc1).end = auVar57._0_8_;
        (pTVar7->alloc1).allocBlockSize = auVar57._8_8_;
        (pTVar7->alloc1).bytesUsed = auVar57._16_8_;
        (pTVar7->alloc1).bytesWasted = auVar57._24_8_;
        (pTVar7->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar7->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
      isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
      vSplitMask.field_0._0_8_ = pTVar7;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar8._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar8,(ThreadLocal2 **)&vSplitMask);
      }
      else {
        *iVar8._M_current = (ThreadLocal2 *)vSplitMask.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (vSplitPos.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)vSplitPos.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)_reduction;
    sVar33 = (alloc.talloc0)->cur;
    uVar24 = (ulong)(-(int)sVar33 & 0xf);
    uVar39 = sVar33 + (long)_reduction + uVar24;
    (alloc.talloc0)->cur = uVar39;
    if ((alloc.talloc0)->end < uVar39) {
      (alloc.talloc0)->cur = sVar33;
      if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
      }
      else {
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar41;
        sVar33 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar33;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
          pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
          (alloc.talloc0)->ptr = pcVar41;
          sVar33 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar33;
          (alloc.talloc0)->end = (size_t)isLeft.split;
          (alloc.talloc0)->cur = (size_t)_reduction;
          if (isLeft.split < _reduction) {
            (alloc.talloc0)->cur = 0;
            pcVar41 = (char *)0x0;
            goto LAB_01352ce9;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar33;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar24;
      pcVar41 = (alloc.talloc0)->ptr + (uVar39 - (long)_reduction);
    }
LAB_01352ce9:
    uVar24 = 1;
  }
  else {
    _reduction = (code *)0x100;
    pTVar7 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar7->alloc)._M_b._M_p) {
      vSplitPos.field_0.v[1]._0_1_ = 1;
      vSplitPos.field_0.v[0] = (longlong)pTVar7;
      MutexSys::lock(&pTVar7->mutex);
      if ((pTVar7->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar7->alloc1).bytesUsed + (pTVar7->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar7->alloc0).end + (pTVar7->alloc1).end) -
             ((pTVar7->alloc0).cur + (pTVar7->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar7->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar7->alloc1).bytesWasted + (pTVar7->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar57 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar7->alloc0).end = auVar57._0_8_;
      (pTVar7->alloc0).allocBlockSize = auVar57._8_8_;
      (pTVar7->alloc0).bytesUsed = auVar57._16_8_;
      (pTVar7->alloc0).bytesWasted = auVar57._24_8_;
      (pTVar7->alloc0).ptr = (char *)auVar57._0_8_;
      (pTVar7->alloc0).cur = auVar57._8_8_;
      (pTVar7->alloc0).end = auVar57._16_8_;
      (pTVar7->alloc0).allocBlockSize = auVar57._24_8_;
      auVar57 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar7->alloc1).end = auVar57._0_8_;
        (pTVar7->alloc1).allocBlockSize = auVar57._8_8_;
        (pTVar7->alloc1).bytesUsed = auVar57._16_8_;
        (pTVar7->alloc1).bytesWasted = auVar57._24_8_;
        (pTVar7->alloc1).ptr = (char *)auVar57._0_8_;
        (pTVar7->alloc1).cur = auVar57._8_8_;
        (pTVar7->alloc1).end = auVar57._16_8_;
        (pTVar7->alloc1).allocBlockSize = auVar57._24_8_;
      }
      else {
        (pTVar7->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar7->alloc1).ptr = (char *)auVar57._0_8_;
        (pTVar7->alloc1).cur = auVar57._8_8_;
        (pTVar7->alloc1).end = auVar57._16_8_;
        (pTVar7->alloc1).allocBlockSize = auVar57._24_8_;
        (pTVar7->alloc1).end = auVar57._0_8_;
        (pTVar7->alloc1).allocBlockSize = auVar57._8_8_;
        (pTVar7->alloc1).bytesUsed = auVar57._16_8_;
        (pTVar7->alloc1).bytesWasted = auVar57._24_8_;
        (pTVar7->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar7->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
      isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
      vSplitMask.field_0._0_8_ = pTVar7;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar8._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar8,(ThreadLocal2 **)&vSplitMask);
      }
      else {
        *iVar8._M_current = (ThreadLocal2 *)vSplitMask.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (vSplitPos.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)vSplitPos.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)_reduction;
    sVar33 = (alloc.talloc0)->cur;
    uVar24 = (ulong)(-(int)sVar33 & 0xf);
    uVar39 = sVar33 + (long)_reduction + uVar24;
    (alloc.talloc0)->cur = uVar39;
    if ((alloc.talloc0)->end < uVar39) {
      (alloc.talloc0)->cur = sVar33;
      if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
      }
      else {
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar41;
        sVar33 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar33;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
          pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
          (alloc.talloc0)->ptr = pcVar41;
          sVar33 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar33;
          (alloc.talloc0)->end = (size_t)isLeft.split;
          (alloc.talloc0)->cur = (size_t)_reduction;
          if (isLeft.split < _reduction) {
            (alloc.talloc0)->cur = 0;
            pcVar41 = (char *)0x0;
            goto LAB_01352c50;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar33;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar24;
      pcVar41 = (alloc.talloc0)->ptr + (uVar39 - (long)_reduction);
    }
LAB_01352c50:
    pcVar41[0xe0] = '\0';
    pcVar41[0xe1] = '\0';
    pcVar41[0xe2] = -0x80;
    pcVar41[0xe3] = '\x7f';
    pcVar41[0xe4] = '\0';
    pcVar41[0xe5] = '\0';
    pcVar41[0xe6] = -0x80;
    pcVar41[0xe7] = '\x7f';
    pcVar41[0xe8] = '\0';
    pcVar41[0xe9] = '\0';
    pcVar41[0xea] = -0x80;
    pcVar41[0xeb] = '\x7f';
    pcVar41[0xec] = '\0';
    pcVar41[0xed] = '\0';
    pcVar41[0xee] = -0x80;
    pcVar41[0xef] = '\x7f';
    pcVar41[0xf0] = '\0';
    pcVar41[0xf1] = '\0';
    pcVar41[0xf2] = -0x80;
    pcVar41[0xf3] = -1;
    pcVar41[0xf4] = '\0';
    pcVar41[0xf5] = '\0';
    pcVar41[0xf6] = -0x80;
    pcVar41[0xf7] = -1;
    pcVar41[0xf8] = '\0';
    pcVar41[0xf9] = '\0';
    pcVar41[0xfa] = -0x80;
    pcVar41[0xfb] = -1;
    pcVar41[0xfc] = '\0';
    pcVar41[0xfd] = '\0';
    pcVar41[0xfe] = -0x80;
    pcVar41[0xff] = -1;
    uVar24 = 6;
  }
  uVar39 = local_848;
  aVar65.m128[2] = INFINITY;
  aVar65._0_8_ = 0x7f8000007f800000;
  aVar65.m128[3] = INFINITY;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pcVar41 + 0x60) = aVar65;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pcVar41 + 0x40) = aVar65;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pcVar41 + 0x20) = aVar65;
  pcVar41[0x70] = '\0';
  pcVar41[0x71] = '\0';
  pcVar41[0x72] = -0x80;
  pcVar41[0x73] = -1;
  pcVar41[0x74] = '\0';
  pcVar41[0x75] = '\0';
  pcVar41[0x76] = -0x80;
  pcVar41[0x77] = -1;
  pcVar41[0x78] = '\0';
  pcVar41[0x79] = '\0';
  pcVar41[0x7a] = -0x80;
  pcVar41[0x7b] = -1;
  pcVar41[0x7c] = '\0';
  pcVar41[0x7d] = '\0';
  pcVar41[0x7e] = -0x80;
  pcVar41[0x7f] = -1;
  pcVar41[0x50] = '\0';
  pcVar41[0x51] = '\0';
  pcVar41[0x52] = -0x80;
  pcVar41[0x53] = -1;
  pcVar41[0x54] = '\0';
  pcVar41[0x55] = '\0';
  pcVar41[0x56] = -0x80;
  pcVar41[0x57] = -1;
  pcVar41[0x58] = '\0';
  pcVar41[0x59] = '\0';
  pcVar41[0x5a] = -0x80;
  pcVar41[0x5b] = -1;
  pcVar41[0x5c] = '\0';
  pcVar41[0x5d] = '\0';
  pcVar41[0x5e] = -0x80;
  pcVar41[0x5f] = -1;
  local_19d8.m128[2] = -INFINITY;
  local_19d8._0_8_ = 0xff800000ff800000;
  local_19d8.m128[3] = -INFINITY;
  pcVar41[0x30] = '\0';
  pcVar41[0x31] = '\0';
  pcVar41[0x32] = -0x80;
  pcVar41[0x33] = -1;
  pcVar41[0x34] = '\0';
  pcVar41[0x35] = '\0';
  pcVar41[0x36] = -0x80;
  pcVar41[0x37] = -1;
  pcVar41[0x38] = '\0';
  pcVar41[0x39] = '\0';
  pcVar41[0x3a] = -0x80;
  pcVar41[0x3b] = -1;
  pcVar41[0x3c] = '\0';
  pcVar41[0x3d] = '\0';
  pcVar41[0x3e] = -0x80;
  pcVar41[0x3f] = -1;
  auVar47 = ZEXT816(0);
  *(undefined1 (*) [32])(pcVar41 + 0x80) = ZEXT1632(auVar47);
  *(undefined1 (*) [32])(pcVar41 + 0xa0) = ZEXT1632(auVar47);
  *(undefined1 (*) [32])(pcVar41 + 0xc0) = ZEXT1632(auVar47);
  pcVar41[0] = '\b';
  pcVar41[1] = '\0';
  pcVar41[2] = '\0';
  pcVar41[3] = '\0';
  pcVar41[4] = '\0';
  pcVar41[5] = '\0';
  pcVar41[6] = '\0';
  pcVar41[7] = '\0';
  pcVar41[8] = '\b';
  pcVar41[9] = '\0';
  pcVar41[10] = '\0';
  pcVar41[0xb] = '\0';
  pcVar41[0xc] = '\0';
  pcVar41[0xd] = '\0';
  pcVar41[0xe] = '\0';
  pcVar41[0xf] = '\0';
  pcVar41[0x10] = '\b';
  pcVar41[0x11] = '\0';
  pcVar41[0x12] = '\0';
  pcVar41[0x13] = '\0';
  pcVar41[0x14] = '\0';
  pcVar41[0x15] = '\0';
  pcVar41[0x16] = '\0';
  pcVar41[0x17] = '\0';
  pcVar41[0x18] = '\b';
  pcVar41[0x19] = '\0';
  pcVar41[0x1a] = '\0';
  pcVar41[0x1b] = '\0';
  pcVar41[0x1c] = '\0';
  pcVar41[0x1d] = '\0';
  pcVar41[0x1e] = '\0';
  pcVar41[0x1f] = '\0';
  uVar24 = uVar24 | (ulong)pcVar41;
  if ((this->cfg).singleThreadThreshold <
      (current->prims).super_PrimInfoMB.object_range._end -
      (current->prims).super_PrimInfoMB.object_range._begin) {
    vSplitMask.field_0._0_8_ = values;
    aStack_1828._0_8_ = &lock;
    isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
    vSplitMask.field_0._8_8_ = this;
    tbb::detail::r1::initialize((task_group_context *)&isLeft);
    vSplitPos.field_0.v[1] = 0;
    vSplitPos.field_0.v[0] = uVar39;
    local_1768._0_8_ = (BBox1f *)0x1;
    _reduction = (code *)&vSplitMask;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&vSplitPos,(anon_class_8_1_898bcfc2 *)&reduction,
          (auto_partitioner *)&reduction2,(task_group_context *)&isLeft);
    cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
    if (cVar22 != '\0') {
      prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar34,"task cancelled");
      __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)&isLeft);
    aVar69.m128[2] = -INFINITY;
    aVar69._0_8_ = 0xff800000ff800000;
    aVar69.m128[3] = -INFINITY;
    aVar65.m128[2] = INFINITY;
    aVar65._0_8_ = 0x7f8000007f800000;
    aVar65.m128[3] = INFINITY;
    aVar66 = aVar65;
    local_19d8 = aVar69;
    if (local_848 == 0) goto LAB_013530f7;
    paVar31 = &values[0].lbounds.bounds1.upper.field_0;
    uVar39 = local_848;
    do {
      aVar65.m128 = (__m128)vminps_avx(aVar65.m128,paVar31[-3]);
      aVar69.m128 = (__m128)vmaxps_avx(aVar69.m128,paVar31[-2]);
      aVar66.m128 = (__m128)vminps_avx(aVar66.m128,*(undefined1 (*) [16])&paVar31[-1].field_1.x);
      local_19d8.m128 = (__m128)vmaxps_avx(local_19d8.m128,*paVar31);
      paVar31 = paVar31 + 6;
      uVar39 = uVar39 - 1;
    } while (uVar39 != 0);
  }
  else if ((long)(local_848 - 1) < 0) {
    aVar69.m128[2] = -INFINITY;
    aVar69._0_8_ = 0xff800000ff800000;
    aVar69.m128[3] = -INFINITY;
    aVar66 = aVar65;
  }
  else {
    pBVar38 = &BStack_648 + local_848 * 0xc;
    current_00 = (BuildRecord *)&(&lock)[local_848 * 0xb].mutex;
    local_1a18.m128[2] = INFINITY;
    local_1a18._0_8_ = 0x7f8000007f800000;
    local_1a18.m128[3] = INFINITY;
    local_19f8.m128[2] = INFINITY;
    local_19f8._0_8_ = 0x7f8000007f800000;
    local_19f8.m128[3] = INFINITY;
    local_1a08.m128[2] = -INFINITY;
    local_1a08._0_8_ = 0xff800000ff800000;
    local_1a08.m128[3] = -INFINITY;
    local_19d8.m128[2] = -INFINITY;
    local_19d8._0_8_ = 0xff800000ff800000;
    local_19d8.m128[3] = -INFINITY;
    do {
      current_00 = current_00 + -1;
      alloc_01.talloc0 = alloc.talloc0;
      alloc_01.alloc = alloc.alloc;
      alloc_01.talloc1 = alloc.talloc1;
      recurse((NodeRecordMB4D *)&isLeft,this,current_00,alloc_01,false);
      pBVar38[-10] = (BBox1f)isLeft.split;
      auVar15._8_4_ = uStack_1990;
      auVar15._0_8_ = isLeft.vSplitMask;
      auVar15._12_4_ = uStack_198c;
      *(undefined1 (*) [16])(pBVar38 + -8) = auVar15;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
       ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar38 + -6))->m128 = _auStack_1988;
      auVar16._4_4_ = local_1978.m128[1];
      auVar16._0_4_ = local_1978.m128[0];
      auVar16._8_4_ = local_1978.m128[2];
      auVar16._12_4_ = local_1978.m128[3];
      *(undefined1 (*) [16])(pBVar38 + -4) = auVar16;
      auVar17._4_4_ = aStack_1968.m128[1];
      auVar17._0_4_ = aStack_1968.m128[0];
      auVar17._8_4_ = aStack_1968.m128[2];
      auVar17._12_4_ = aStack_1968.m128[3];
      *(undefined1 (*) [16])(pBVar38 + -2) = auVar17;
      *pBVar38 = local_1958;
      aVar65.m128 = (__m128)vminps_avx(local_1a18.m128,auVar15);
      aVar69.m128 = (__m128)vmaxps_avx(local_1a08.m128,_auStack_1988);
      aVar66.m128 = (__m128)vminps_avx(local_19f8.m128,auVar16);
      local_19d8.m128 = (__m128)vmaxps_avx(local_19d8.m128,auVar17);
      uVar39 = uVar39 - 1;
      pBVar38 = pBVar38 + -0xc;
      local_1a18 = aVar65;
      local_1a08 = aVar69;
      local_19f8 = aVar66;
    } while (0 < (long)uVar39);
  }
  if (((uint)uVar24 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar42 = (ulong)pcVar41 & 0xfffffffffffffff0;
      pfVar32 = &values[0].dt.upper;
      uVar39 = 0;
      auVar70._8_4_ = 0x7f7fffff;
      auVar70._0_8_ = 0x7f7fffff7f7fffff;
      auVar70._12_4_ = 0x7f7fffff;
      auVar75._8_4_ = 0xff7fffff;
      auVar75._0_8_ = 0xff7fffffff7fffff;
      auVar75._12_4_ = 0xff7fffff;
      auVar77._8_4_ = 0x7fffffff;
      auVar77._0_8_ = 0x7fffffff7fffffff;
      auVar77._12_4_ = 0x7fffffff;
      do {
        *(undefined8 *)(uVar42 + uVar39 * 8) = *(undefined8 *)(pfVar32 + -0x15);
        fVar46 = ((BBox1f *)(pfVar32 + -1))->lower;
        fVar79 = 1.0 / (*pfVar32 - fVar46);
        fVar3 = -fVar46 * fVar79;
        auVar47 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
        auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar3)),ZEXT416((uint)(1.0 - fVar3)),0);
        auVar98._0_4_ = pfVar32[-9] * auVar47._0_4_ + pfVar32[-0x11] * auVar54._0_4_;
        auVar98._4_4_ = pfVar32[-8] * auVar47._4_4_ + pfVar32[-0x10] * auVar54._4_4_;
        auVar98._8_4_ = pfVar32[-7] * auVar47._8_4_ + pfVar32[-0xf] * auVar54._8_4_;
        auVar98._12_4_ = pfVar32[-6] * auVar47._12_4_ + pfVar32[-0xe] * auVar54._12_4_;
        auVar87._0_4_ = pfVar32[-5] * auVar47._0_4_ + pfVar32[-0xd] * auVar54._0_4_;
        auVar87._4_4_ = pfVar32[-4] * auVar47._4_4_ + pfVar32[-0xc] * auVar54._4_4_;
        auVar87._8_4_ = pfVar32[-3] * auVar47._8_4_ + pfVar32[-0xb] * auVar54._8_4_;
        auVar87._12_4_ = pfVar32[-2] * auVar47._12_4_ + pfVar32[-10] * auVar54._12_4_;
        fVar79 = (1.0 - fVar46) * fVar79;
        auVar47 = vshufps_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79),0);
        auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar79)),ZEXT416((uint)(1.0 - fVar79)),0);
        auVar90._0_4_ = pfVar32[-9] * auVar47._0_4_ + pfVar32[-0x11] * auVar54._0_4_;
        auVar90._4_4_ = pfVar32[-8] * auVar47._4_4_ + pfVar32[-0x10] * auVar54._4_4_;
        auVar90._8_4_ = pfVar32[-7] * auVar47._8_4_ + pfVar32[-0xf] * auVar54._8_4_;
        auVar90._12_4_ = pfVar32[-6] * auVar47._12_4_ + pfVar32[-0xe] * auVar54._12_4_;
        auVar80._0_4_ = pfVar32[-5] * auVar47._0_4_ + pfVar32[-0xd] * auVar54._0_4_;
        auVar80._4_4_ = pfVar32[-4] * auVar47._4_4_ + pfVar32[-0xc] * auVar54._4_4_;
        auVar80._8_4_ = pfVar32[-3] * auVar47._8_4_ + pfVar32[-0xb] * auVar54._8_4_;
        auVar80._12_4_ = pfVar32[-2] * auVar47._12_4_ + pfVar32[-10] * auVar54._12_4_;
        auVar56 = vminps_avx(auVar98,auVar70);
        auVar54 = vmaxps_avx(auVar87,auVar75);
        auVar67 = vminps_avx(auVar90,auVar70);
        auVar55 = vmaxps_avx(auVar80,auVar75);
        auVar47 = vandps_avx(auVar56,auVar77);
        auVar93._0_4_ = auVar47._0_4_ * 4.7683716e-07;
        auVar93._4_4_ = auVar47._4_4_ * 4.7683716e-07;
        auVar93._8_4_ = auVar47._8_4_ * 4.7683716e-07;
        auVar93._12_4_ = auVar47._12_4_ * 4.7683716e-07;
        auVar56 = vsubps_avx(auVar56,auVar93);
        auVar47 = vandps_avx(auVar54,auVar77);
        auVar88._0_4_ = auVar54._0_4_ + auVar47._0_4_ * 4.7683716e-07;
        auVar88._4_4_ = auVar54._4_4_ + auVar47._4_4_ * 4.7683716e-07;
        auVar88._8_4_ = auVar54._8_4_ + auVar47._8_4_ * 4.7683716e-07;
        auVar88._12_4_ = auVar54._12_4_ + auVar47._12_4_ * 4.7683716e-07;
        auVar47 = vandps_avx(auVar67,auVar77);
        auVar94._0_4_ = auVar47._0_4_ * 4.7683716e-07;
        auVar94._4_4_ = auVar47._4_4_ * 4.7683716e-07;
        auVar94._8_4_ = auVar47._8_4_ * 4.7683716e-07;
        auVar94._12_4_ = auVar47._12_4_ * 4.7683716e-07;
        auVar54 = vsubps_avx(auVar67,auVar94);
        auVar47 = vandps_avx(auVar55,auVar77);
        *(int *)(uVar42 + 0x20 + uVar39 * 4) = auVar56._0_4_;
        uVar5 = vextractps_avx(auVar56,1);
        *(undefined4 *)(uVar42 + 0x40 + uVar39 * 4) = uVar5;
        auVar81._0_4_ = auVar47._0_4_ * 4.7683716e-07 + auVar55._0_4_;
        auVar81._4_4_ = auVar47._4_4_ * 4.7683716e-07 + auVar55._4_4_;
        auVar81._8_4_ = auVar47._8_4_ * 4.7683716e-07 + auVar55._8_4_;
        auVar81._12_4_ = auVar47._12_4_ * 4.7683716e-07 + auVar55._12_4_;
        uVar5 = vextractps_avx(auVar56,2);
        *(undefined4 *)(uVar42 + 0x60 + uVar39 * 4) = uVar5;
        *(float *)(uVar42 + 0x30 + uVar39 * 4) = auVar88._0_4_;
        uVar5 = vextractps_avx(auVar88,1);
        *(undefined4 *)(uVar42 + 0x50 + uVar39 * 4) = uVar5;
        auVar47 = vsubps_avx(auVar54,auVar56);
        uVar5 = vextractps_avx(auVar88,2);
        *(undefined4 *)(uVar42 + 0x70 + uVar39 * 4) = uVar5;
        *(int *)(uVar42 + 0x80 + uVar39 * 4) = auVar47._0_4_;
        uVar5 = vextractps_avx(auVar47,1);
        *(undefined4 *)(uVar42 + 0xa0 + uVar39 * 4) = uVar5;
        auVar54 = vsubps_avx(auVar81,auVar88);
        uVar5 = vextractps_avx(auVar47,2);
        *(undefined4 *)(uVar42 + 0xc0 + uVar39 * 4) = uVar5;
        *(int *)(uVar42 + 0x90 + uVar39 * 4) = auVar54._0_4_;
        uVar5 = vextractps_avx(auVar54,1);
        *(undefined4 *)(uVar42 + 0xb0 + uVar39 * 4) = uVar5;
        uVar5 = vextractps_avx(auVar54,2);
        *(undefined4 *)(uVar42 + 0xd0 + uVar39 * 4) = uVar5;
        uVar39 = uVar39 + 1;
        pfVar32 = pfVar32 + 0x18;
        local_1a18 = aVar65;
        local_1a08 = aVar69;
        local_19f8 = aVar66;
      } while (local_848 != uVar39);
    }
  }
  else {
    local_1a18 = aVar65;
    local_1a08 = aVar69;
    local_19f8 = aVar66;
    if (local_848 != 0) {
      uVar42 = (ulong)pcVar41 & 0xfffffffffffffff0;
      pfVar32 = &values[0].dt.upper;
      uVar39 = 0;
      auVar71._8_4_ = 0x7f7fffff;
      auVar71._0_8_ = 0x7f7fffff7f7fffff;
      auVar71._12_4_ = 0x7f7fffff;
      auVar76._8_4_ = 0xff7fffff;
      auVar76._0_8_ = 0xff7fffffff7fffff;
      auVar76._12_4_ = 0xff7fffff;
      auVar78._8_4_ = 0x7fffffff;
      auVar78._0_8_ = 0x7fffffff7fffffff;
      auVar78._12_4_ = 0x7fffffff;
      auVar82._8_4_ = 0x3f800001;
      auVar82._0_8_ = 0x3f8000013f800001;
      auVar82._12_4_ = 0x3f800001;
      do {
        *(undefined8 *)(uVar42 + uVar39 * 8) = *(undefined8 *)(pfVar32 + -0x15);
        fVar46 = ((BBox1f *)(pfVar32 + -1))->lower;
        fVar79 = 1.0 / (*pfVar32 - fVar46);
        fVar3 = -fVar46 * fVar79;
        auVar47 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
        auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar3)),ZEXT416((uint)(1.0 - fVar3)),0);
        auVar99._0_4_ = pfVar32[-9] * auVar47._0_4_ + pfVar32[-0x11] * auVar54._0_4_;
        auVar99._4_4_ = pfVar32[-8] * auVar47._4_4_ + pfVar32[-0x10] * auVar54._4_4_;
        auVar99._8_4_ = pfVar32[-7] * auVar47._8_4_ + pfVar32[-0xf] * auVar54._8_4_;
        auVar99._12_4_ = pfVar32[-6] * auVar47._12_4_ + pfVar32[-0xe] * auVar54._12_4_;
        auVar91._0_4_ = pfVar32[-5] * auVar47._0_4_ + pfVar32[-0xd] * auVar54._0_4_;
        auVar91._4_4_ = pfVar32[-4] * auVar47._4_4_ + pfVar32[-0xc] * auVar54._4_4_;
        auVar91._8_4_ = pfVar32[-3] * auVar47._8_4_ + pfVar32[-0xb] * auVar54._8_4_;
        auVar91._12_4_ = pfVar32[-2] * auVar47._12_4_ + pfVar32[-10] * auVar54._12_4_;
        fVar79 = (1.0 - fVar46) * fVar79;
        auVar47 = vshufps_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79),0);
        auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar79)),ZEXT416((uint)(1.0 - fVar79)),0);
        auVar95._0_4_ = pfVar32[-9] * auVar47._0_4_ + pfVar32[-0x11] * auVar54._0_4_;
        auVar95._4_4_ = pfVar32[-8] * auVar47._4_4_ + pfVar32[-0x10] * auVar54._4_4_;
        auVar95._8_4_ = pfVar32[-7] * auVar47._8_4_ + pfVar32[-0xf] * auVar54._8_4_;
        auVar95._12_4_ = pfVar32[-6] * auVar47._12_4_ + pfVar32[-0xe] * auVar54._12_4_;
        auVar84._0_4_ = pfVar32[-0xd] * auVar54._0_4_ + pfVar32[-5] * auVar47._0_4_;
        auVar84._4_4_ = pfVar32[-0xc] * auVar54._4_4_ + pfVar32[-4] * auVar47._4_4_;
        auVar84._8_4_ = pfVar32[-0xb] * auVar54._8_4_ + pfVar32[-3] * auVar47._8_4_;
        auVar84._12_4_ = pfVar32[-10] * auVar54._12_4_ + pfVar32[-2] * auVar47._12_4_;
        auVar56 = vminps_avx(auVar99,auVar71);
        auVar54 = vmaxps_avx(auVar91,auVar76);
        auVar67 = vminps_avx(auVar95,auVar71);
        auVar55 = vmaxps_avx(auVar84,auVar76);
        auVar47 = vandps_avx(auVar56,auVar78);
        auVar96._0_4_ = auVar47._0_4_ * 4.7683716e-07;
        auVar96._4_4_ = auVar47._4_4_ * 4.7683716e-07;
        auVar96._8_4_ = auVar47._8_4_ * 4.7683716e-07;
        auVar96._12_4_ = auVar47._12_4_ * 4.7683716e-07;
        auVar56 = vsubps_avx(auVar56,auVar96);
        auVar47 = vandps_avx(auVar54,auVar78);
        auVar92._0_4_ = auVar54._0_4_ + auVar47._0_4_ * 4.7683716e-07;
        auVar92._4_4_ = auVar54._4_4_ + auVar47._4_4_ * 4.7683716e-07;
        auVar92._8_4_ = auVar54._8_4_ + auVar47._8_4_ * 4.7683716e-07;
        auVar92._12_4_ = auVar54._12_4_ + auVar47._12_4_ * 4.7683716e-07;
        auVar47 = vandps_avx(auVar67,auVar78);
        auVar97._0_4_ = auVar47._0_4_ * 4.7683716e-07;
        auVar97._4_4_ = auVar47._4_4_ * 4.7683716e-07;
        auVar97._8_4_ = auVar47._8_4_ * 4.7683716e-07;
        auVar97._12_4_ = auVar47._12_4_ * 4.7683716e-07;
        auVar54 = vsubps_avx(auVar67,auVar97);
        auVar47 = vandps_avx(auVar55,auVar78);
        *(int *)(uVar42 + 0x20 + uVar39 * 4) = auVar56._0_4_;
        uVar5 = vextractps_avx(auVar56,1);
        *(undefined4 *)(uVar42 + 0x40 + uVar39 * 4) = uVar5;
        auVar85._0_4_ = auVar47._0_4_ * 4.7683716e-07 + auVar55._0_4_;
        auVar85._4_4_ = auVar47._4_4_ * 4.7683716e-07 + auVar55._4_4_;
        auVar85._8_4_ = auVar47._8_4_ * 4.7683716e-07 + auVar55._8_4_;
        auVar85._12_4_ = auVar47._12_4_ * 4.7683716e-07 + auVar55._12_4_;
        uVar5 = vextractps_avx(auVar56,2);
        *(undefined4 *)(uVar42 + 0x60 + uVar39 * 4) = uVar5;
        *(float *)(uVar42 + 0x30 + uVar39 * 4) = auVar92._0_4_;
        uVar5 = vextractps_avx(auVar92,1);
        *(undefined4 *)(uVar42 + 0x50 + uVar39 * 4) = uVar5;
        auVar47 = vsubps_avx(auVar54,auVar56);
        uVar5 = vextractps_avx(auVar92,2);
        *(undefined4 *)(uVar42 + 0x70 + uVar39 * 4) = uVar5;
        *(int *)(uVar42 + 0x80 + uVar39 * 4) = auVar47._0_4_;
        uVar5 = vextractps_avx(auVar47,1);
        *(undefined4 *)(uVar42 + 0xa0 + uVar39 * 4) = uVar5;
        auVar54 = vsubps_avx(auVar85,auVar92);
        uVar5 = vextractps_avx(auVar47,2);
        *(undefined4 *)(uVar42 + 0xc0 + uVar39 * 4) = uVar5;
        *(int *)(uVar42 + 0x90 + uVar39 * 4) = auVar54._0_4_;
        uVar5 = vextractps_avx(auVar54,1);
        *(undefined4 *)(uVar42 + 0xb0 + uVar39 * 4) = uVar5;
        uVar5 = vextractps_avx(auVar54,2);
        *(undefined4 *)(uVar42 + 0xd0 + uVar39 * 4) = uVar5;
        *(float *)(uVar42 + 0xe0 + uVar39 * 4) = ((BBox1f *)(pfVar32 + -1))->lower;
        auVar47 = vcmpss_avx(ZEXT416((uint)*pfVar32),SUB6416(ZEXT464(0x3f800000),0),0);
        auVar47 = vblendvps_avx(ZEXT416((uint)*pfVar32),auVar82,auVar47);
        *(int *)(uVar42 + 0xf0 + uVar39 * 4) = auVar47._0_4_;
        uVar39 = uVar39 + 1;
        pfVar32 = pfVar32 + 0x18;
      } while (local_848 != uVar39);
    }
  }
LAB_013530f7:
  if ((bVar44 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = uVar24;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = aVar65;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aVar69;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = aVar66;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_19d8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         local_19d8._8_8_;
    BVar36 = (current->prims).super_PrimInfoMB.time_range;
  }
  else {
    vSplitPos_1.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos_1.field_0.v[0] = (longlong)local_19e0;
    pSVar11 = (Split *)(current->prims).super_PrimInfoMB.object_range._begin;
    pSVar12 = (Split *)(current->prims).super_PrimInfoMB.object_range._end;
    vSplitPos.field_0.i[2] = 0x7f800000;
    vSplitPos.field_0.v[0] = 0x7f8000007f800000;
    vSplitPos.field_0.i[3] = 0x7f800000;
    local_1768._0_8_ = (BBox1f *)0xff800000ff800000;
    local_1768._8_8_ = 0xff800000ff800000;
    piStack_1758 = (intrusive_list_node *)0x7f8000007f800000;
    piStack_1750 = (intrusive_list_node *)0x7f8000007f800000;
    local_1748._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
    pvStack_1740 = (void *)0xff800000ff800000;
    if ((ulong)((long)pSVar12 - (long)pSVar11) < 0xc00) {
      isLeft.split = pSVar11;
      isLeft.vSplitPos = (vint *)pSVar12;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&vSplitMask,(anon_class_16_2_aeee9775 *)&vSplitPos_1,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
      tbb::detail::r1::initialize((task_group_context *)&isLeft);
      _reduction2 = &time_range0;
      _reduction = (code *)pSVar12;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&vSplitMask,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&vSplitPos,(LBBox<embree::Vec3fa> *)&reduction2,
                 (anon_class_16_2_ed117de8_conflict31 *)_reduction2,
                 (anon_class_1_0_00000001 *)&isLeft,in_stack_ffffffffffffe5b8);
      cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar22 != '\0') {
        prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar34,"task cancelled");
        __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&isLeft);
    }
    (__return_storage_ptr__->ref).ptr = uVar24;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         vSplitMask.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         vSplitMask.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aStack_1828._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         aStack_1828._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1818._0_8_;
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_1818.i[3],local_1818.i[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 =
         CONCAT44(aStack_1808.i[1],aStack_1808.i[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         CONCAT44(aStack_1808.i[3],aStack_1808.i[2]);
    BVar36 = (current->prims).super_PrimInfoMB.time_range;
  }
  __return_storage_ptr__->dt = BVar36;
  if (local_848 != 0) {
    uVar24 = 0;
    do {
      pBVar9 = local_8c8[uVar24];
      pBVar38 = pBVar9 + 1;
      *pBVar38 = (BBox1f)((long)*pBVar38 + -1);
      if (*pBVar38 == (BBox1f)0x0) {
        BVar36 = *pBVar9;
        if (BVar36 != (BBox1f)0x0) {
          lVar35 = *(undefined8 *)((long)BVar36 + 0x18);
          pvVar27 = *(void **)((long)BVar36 + 0x20);
          if (pvVar27 != (void *)0x0) {
            if ((ulong)(lVar35 * 0x50) < 0x1c00000) {
              alignedFree(pvVar27);
            }
            else {
              os_free(pvVar27,lVar35 * 0x50,*(bool *)((long)BVar36 + 8));
            }
          }
          if (lVar35 != 0) {
            (**(code **)**(undefined8 **)BVar36)(*(undefined8 **)BVar36,lVar35 * -0x50,1);
          }
          *(undefined8 *)((long)BVar36 + 0x10) = 0;
          *(undefined8 *)((long)BVar36 + 0x18) = 0;
          *(undefined8 *)((long)BVar36 + 0x20) = 0;
        }
        operator_delete((void *)BVar36);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 < local_848);
  }
  if (local_1a28 !=
      (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_> *)
      0x0) {
    std::
    default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
    ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                  *)&local_1a28,local_1a28);
  }
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D recurse(const BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            const Split csplit = find(current.prims);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*current.prims.halfArea()+cfg.intCost*csplit.splitSAH();
            assert((current.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              current.prims.deterministic_order();
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            SetMB lprims,rprims;
            std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,current.prims,lprims,rprims);
            bool hasTimeSplits = new_vector != nullptr;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildList children(current);
            {
              BuildRecord lrecord(lprims,current.depth+1);
              BuildRecord rrecord(rprims,current.depth+1);
              children.split(0,lrecord,rrecord,std::move(new_vector));
            }

            /*! split until node is full or SAH tells us to stop */
            while (children.size() < cfg.branchingFactor) 
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<children.size(); i++)
              {
                if (children[i].size() <= cfg.minLeafSize) continue;
                if (expectedApproxHalfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i; bestArea = expectedApproxHalfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              Split csplit = find(brecord.prims);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));
            }

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = current.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* sort buildrecords for simpler shadow ray traversal */
            //std::sort(&children[0],&children[children.size()],std::greater<BuildRecord>()); // FIXME: reduces traversal performance of bvh8.triangle4 (need to verified) !!

            /*! create an inner node */
            auto node = createNode(children.children.data(), children.numChildren, alloc, hasTimeSplits);
            LBBox3fa gbounds = empty;

            /* spawn tasks */
            if (unlikely(current.size() > cfg.singleThreadThreshold))
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), children.size(), [&] (const range<size_t>& r) {
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              /*! merge bounding boxes */
              for (size_t i=0; i<children.size(); i++)
                gbounds.extend(values[i].lbounds);
            }
            /* recurse into each child */
            else
            {
              //for (size_t i=0; i<children.size(); i++)
              for (ssize_t i=children.size()-1; i>=0; i--) {
                values[i] = recurse(children[i],alloc,false);
                gbounds.extend(values[i].lbounds);
              }
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (unlikely(hasTimeSplits))
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }